

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image.h
# Opt level: O3

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  stbi__uint32 c;
  bool bVar1;
  bool bVar2;
  undefined1 auVar3 [8];
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  stbi_uc sVar9;
  byte bVar10;
  byte bVar11;
  stbi_uc sVar12;
  stbi_uc sVar13;
  char cVar14;
  bool bVar15;
  stbi_uc sVar16;
  stbi_uc sVar17;
  stbi_uc sVar18;
  byte bVar19;
  stbi__uint32 sVar20;
  stbi__uint32 sVar21;
  int iVar22;
  stbi__uint32 sVar23;
  uint uVar24;
  int iVar25;
  stbi__uint32 sVar26;
  int iVar27;
  int iVar28;
  stbi__context *psVar29;
  stbi__context *psVar30;
  stbi_uc *__s;
  char *pcVar31;
  float *data;
  stbi_uc *psVar32;
  void *pvVar33;
  undefined1 uVar34;
  uint uVar35;
  undefined1 *puVar36;
  ushort uVar37;
  uint uVar38;
  uint uVar39;
  int iVar40;
  size_t sVar41;
  ulong uVar42;
  uint uVar43;
  uint uVar44;
  uchar uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  undefined4 in_register_00000084;
  int *piVar49;
  int *piVar50;
  ulong uVar51;
  uint uVar52;
  long lVar53;
  uint uVar54;
  long lVar55;
  ulong uVar56;
  ulong uVar57;
  long in_FS_OFFSET;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar102;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar119;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  int iVar159;
  int iVar163;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  stbi__uint16 *local_9798;
  void *local_9788;
  void *local_9778;
  ulong local_9770;
  undefined1 local_9768 [16];
  stbi_uc tc [3];
  undefined1 local_9748 [16];
  undefined1 local_9728 [8];
  undefined1 local_9720 [16];
  stbi__context *local_9710;
  uint local_9708;
  ulong local_9700;
  stbi_uc *local_96f8;
  stbi__uint32 *local_96f0;
  int *local_96e8;
  ulong local_96e0;
  stbi__context *local_96d8;
  stbi__uint32 *local_96d0;
  stbi_uc *local_96c8;
  int local_96c0;
  uint local_96bc;
  undefined8 local_96b8;
  stbi_uc *local_96b0;
  short local_96a6 [3];
  stbi__context *local_96a0;
  undefined8 local_9698;
  int local_968c;
  stbi__context *local_9688;
  ulong local_9680;
  undefined1 local_9678 [15];
  undefined4 uStack_9669;
  byte bStack_9659;
  stbi_uc lencodes [455];
  stbi_uc palette [1024];
  undefined1 local_9088 [36];
  int iStack_9064;
  undefined8 local_9060;
  undefined8 local_9058;
  stbi_uc local_9050 [4];
  stbi__zhuffman local_904c;
  stbi__zhuffman local_8868 [16];
  stbi__uint16 *local_850;
  uint local_848;
  int local_844;
  uint local_840;
  int local_83c;
  int local_838;
  int local_834;
  int local_830;
  int local_82c;
  int local_828;
  int local_824;
  int local_820;
  stbi__zhuffman z_codelength;
  
  piVar49 = (int *)CONCAT44(in_register_00000084,req_comp);
  piVar49[0] = 8;
  piVar49[1] = 0;
  piVar49[2] = 0;
  lVar55 = 0;
  piVar50 = piVar49;
  while( true ) {
    sVar9 = stbi__get8(s);
    iVar22 = (int)piVar50;
    if (sVar9 != (&stbi__check_png_header_png_sig)[lVar55]) break;
    lVar55 = lVar55 + 1;
    if (lVar55 == 8) goto code_r0x0010c9b4;
  }
  *(char **)(in_FS_OFFSET + -8) = "bad png sig";
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  sVar9 = stbi__get8(s);
  if ((sVar9 != 'B') || (sVar9 = stbi__get8(s), sVar9 != 'M')) {
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
LAB_0010d196:
    sVar9 = stbi__get8(s);
    if ((((sVar9 == 'G') && (sVar9 = stbi__get8(s), sVar9 == 'I')) &&
        ((sVar9 = stbi__get8(s), sVar9 == 'F' && (sVar9 = stbi__get8(s), sVar9 == '8')))) &&
       ((sVar9 = stbi__get8(s), sVar9 == '7' || (sVar9 == '9')))) {
      sVar9 = stbi__get8(s);
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      if (sVar9 == 'a') {
        memset(local_9088,0,0x8870);
        sVar9 = stbi__get8(s);
        pcVar31 = "not GIF";
        if (((((sVar9 != 'G') || (sVar9 = stbi__get8(s), sVar9 != 'I')) ||
             (sVar9 = stbi__get8(s), sVar9 != 'F')) || (sVar9 = stbi__get8(s), sVar9 != '8')) ||
           (((sVar9 = stbi__get8(s), sVar9 != '9' && (sVar9 != '7')) ||
            (local_96f0 = (stbi__uint32 *)x, local_96d0 = (stbi__uint32 *)y, sVar9 = stbi__get8(s),
            sVar9 != 'a')))) goto LAB_0010f929;
        *(char **)(in_FS_OFFSET + -8) = "";
        sVar9 = stbi__get8(s);
        sVar12 = stbi__get8(s);
        uVar35 = CONCAT22(0,CONCAT11(sVar12,sVar9));
        local_9088._0_4_ = uVar35;
        sVar9 = stbi__get8(s);
        sVar12 = stbi__get8(s);
        local_9088._4_2_ = CONCAT11(sVar12,sVar9);
        local_9088._6_2_ = 0;
        bVar19 = stbi__get8(s);
        stack0xffffffffffff6f98 = (stbi_uc *)CONCAT44(iStack_9064,(uint)bVar19);
        sVar13 = stbi__get8(s);
        stack0xffffffffffff6f98 = (stbi_uc *)(ulong)CONCAT14(sVar13,local_9088._32_4_);
        bVar10 = stbi__get8(s);
        local_9060 = (stbi_uc *)CONCAT44(0xffffffff,(uint)bVar10);
        if (comp != (int *)0x0) {
          *comp = 4;
        }
        uVar24 = (uint)CONCAT11(sVar12,sVar9);
        if ((char)bVar19 < '\0') {
          stbi__gif_parse_colortable
                    (s,(stbi_uc (*) [4])((long)&local_9058 + 4),2 << (bVar19 & 7),-1);
          uVar24 = local_9088._4_4_;
          uVar35 = local_9088._0_4_;
        }
        iVar22 = stbi__mad3sizes_valid(4,uVar35,uVar24,0);
        if (iVar22 == 0) {
          pcVar31 = "too large";
          goto LAB_0010f929;
        }
        iVar22 = uVar35 * uVar24;
        sVar41 = (size_t)(iVar22 * 4);
        psVar30 = (stbi__context *)malloc(sVar41);
        local_9088._8_8_ = psVar30;
        psVar32 = (stbi_uc *)malloc(sVar41);
        local_9088._16_8_ = psVar32;
        __s = (stbi_uc *)malloc((long)iVar22);
        pcVar31 = "outofmem";
        local_9088._24_8_ = __s;
        if ((psVar30 == (stbi__context *)0x0) ||
           (__s == (stbi_uc *)0x0 || psVar32 == (stbi_uc *)0x0)) goto LAB_0010f929;
        memset(psVar30,0,sVar41);
        memset(psVar32,0,sVar41);
        local_9798 = (stbi__uint16 *)((long)&local_9058 + 4);
        uVar56 = (ulong)local_9060 >> 0x20;
        memset(__s,0,(long)iVar22);
        goto LAB_0010d454;
      }
    }
    else {
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
    }
    sVar20 = stbi__get32be(s);
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    if (sVar20 != 0x38425053) {
      iVar25 = stbi__pic_test(s);
      if (iVar25 != 0) {
        pvVar33 = stbi__pic_load(s,x,y,comp,iVar22,ri);
        return pvVar33;
      }
      iVar25 = stbi__jpeg_test(s);
      if (iVar25 != 0) {
        pvVar33 = stbi__jpeg_load(s,x,y,comp,iVar22,ri);
        return pvVar33;
      }
      iVar25 = stbi__pnm_test(s);
      if (iVar25 != 0) {
        pvVar33 = stbi__pnm_load(s,x,y,comp,req_comp,ri);
        return pvVar33;
      }
      iVar25 = stbi__hdr_test(s);
      if (iVar25 != 0) {
        data = stbi__hdr_load(s,x,y,comp,iVar22,ri);
        psVar32 = stbi__hdr_to_ldr(data,*x,*y,(int)comp);
        return psVar32;
      }
      iVar25 = stbi__tga_test(s);
      if (iVar25 != 0) {
        pvVar33 = stbi__tga_load(s,x,y,comp,iVar22,ri);
        return pvVar33;
      }
      pcVar31 = "unknown image type";
      goto LAB_0010f021;
    }
    sVar20 = stbi__get32be(s);
    if (sVar20 != 0x38425053) {
      pcVar31 = "not PSD";
      goto LAB_0010f021;
    }
    sVar9 = stbi__get8(s);
    sVar12 = stbi__get8(s);
    if (CONCAT11(sVar9,sVar12) != 1) {
      pcVar31 = "wrong version";
      goto LAB_0010f021;
    }
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
      psVar32 = s->img_buffer;
LAB_0010d7b8:
      s->img_buffer = psVar32 + 6;
      local_96e8 = comp;
    }
    else {
      psVar32 = s->img_buffer;
      iVar22 = (int)s->img_buffer_end - (int)psVar32;
      if (5 < iVar22) goto LAB_0010d7b8;
      s->img_buffer = s->img_buffer_end;
      local_96e8 = comp;
      (*(s->io).skip)(s->io_user_data,6 - iVar22);
    }
    sVar9 = stbi__get8(s);
    bVar19 = stbi__get8(s);
    uVar35 = (uint)CONCAT11(sVar9,bVar19);
    if (0x10 < uVar35) {
      pcVar31 = "wrong channel count";
      goto LAB_0010f021;
    }
    sVar20 = stbi__get32be(s);
    sVar21 = stbi__get32be(s);
    if ((0x1000000 < (int)sVar20) || (0x1000000 < (int)sVar21)) goto LAB_0010d81a;
    local_96f0 = (stbi__uint32 *)x;
    local_96d0 = (stbi__uint32 *)y;
    sVar9 = stbi__get8(s);
    sVar12 = stbi__get8(s);
    uVar24 = (uint)CONCAT11(sVar9,sVar12);
    if ((uVar24 != 8) && (uVar24 != 0x10)) {
      pcVar31 = "unsupported bit depth";
      goto LAB_0010f021;
    }
    sVar9 = stbi__get8(s);
    sVar12 = stbi__get8(s);
    if (CONCAT11(sVar9,sVar12) != 3) {
      pcVar31 = "wrong color format";
      goto LAB_0010f021;
    }
    sVar23 = stbi__get32be(s);
    stbi__skip(s,sVar23);
    sVar23 = stbi__get32be(s);
    stbi__skip(s,sVar23);
    sVar23 = stbi__get32be(s);
    stbi__skip(s,sVar23);
    uVar54 = stbi__get16be(s);
    if (1 < uVar54) {
      pcVar31 = "bad compression";
      goto LAB_0010f021;
    }
    local_96d8 = (stbi__context *)CONCAT44(local_96d8._4_4_,uVar24);
    iVar22 = stbi__mad3sizes_valid(4,sVar21,sVar20,0);
    if (iVar22 == 0) goto LAB_0010d81a;
    local_96e0 = CONCAT44(local_96e0._4_4_,sVar20);
    uVar24 = sVar21 * sVar20;
    uVar56 = (ulong)uVar24;
    pvVar33 = malloc((long)(int)(uVar24 * 4));
    if (pvVar33 == (void *)0x0) goto LAB_0010f05e;
    if (uVar54 == 0) {
      local_9700 = (ulong)uVar35;
      lVar55 = uVar56 - 1;
      auVar60._8_4_ = (int)lVar55;
      auVar60._0_8_ = lVar55;
      auVar60._12_4_ = (int)((ulong)lVar55 >> 0x20);
      lVar55 = (long)pvVar33 + 0x3c;
      uVar57 = 0;
      auVar137._8_4_ = 0xffffffff;
      auVar137._0_8_ = 0xffffffffffffffff;
      auVar137._12_4_ = 0xffffffff;
      auVar127 = _DAT_00122280;
      local_9788 = pvVar33;
      local_9778 = pvVar33;
      do {
        if (uVar57 < local_9700) {
          if (*piVar49 == 0x10) {
            if (0 < (int)uVar24) {
              lVar53 = 0;
              do {
                sVar9 = stbi__get8(s);
                sVar12 = stbi__get8(s);
                auVar127 = _DAT_00122280;
                auVar137._8_4_ = 0xffffffff;
                auVar137._0_8_ = 0xffffffffffffffff;
                auVar137._12_4_ = 0xffffffff;
                *(ushort *)((long)local_9788 + lVar53 * 8) = CONCAT11(sVar9,sVar12);
                lVar53 = lVar53 + 1;
              } while (uVar24 != (uint)lVar53);
            }
          }
          else if ((int)local_96d8 == 0x10) {
            if (0 < (int)uVar24) {
              lVar53 = 0;
              do {
                sVar9 = stbi__get8(s);
                stbi__get8(s);
                auVar127 = _DAT_00122280;
                auVar137._8_4_ = 0xffffffff;
                auVar137._0_8_ = 0xffffffffffffffff;
                auVar137._12_4_ = 0xffffffff;
                *(stbi_uc *)((long)local_9778 + lVar53 * 4) = sVar9;
                lVar53 = lVar53 + 1;
              } while (uVar24 != (uint)lVar53);
            }
          }
          else if (0 < (int)uVar24) {
            lVar53 = 0;
            do {
              sVar9 = stbi__get8(s);
              auVar127 = _DAT_00122280;
              auVar137._8_4_ = 0xffffffff;
              auVar137._0_8_ = 0xffffffffffffffff;
              auVar137._12_4_ = 0xffffffff;
              *(stbi_uc *)((long)local_9778 + lVar53 * 4) = sVar9;
              lVar53 = lVar53 + 1;
            } while (uVar24 != (uint)lVar53);
          }
        }
        else if (0 < (int)uVar24) {
          cVar14 = -(uVar57 == 3);
          uVar51 = 0;
          do {
            auVar139._8_4_ = (int)uVar51;
            auVar139._0_8_ = uVar51;
            auVar139._12_4_ = (int)(uVar51 >> 0x20);
            auVar64 = auVar60 ^ auVar127;
            auVar82 = (auVar139 | _DAT_00123060) ^ auVar127;
            iVar22 = auVar64._0_4_;
            iVar159 = -(uint)(iVar22 < auVar82._0_4_);
            iVar25 = auVar64._4_4_;
            auVar128._4_4_ = -(uint)(iVar25 < auVar82._4_4_);
            iVar40 = auVar64._8_4_;
            iVar163 = -(uint)(iVar40 < auVar82._8_4_);
            iVar27 = auVar64._12_4_;
            auVar128._12_4_ = -(uint)(iVar27 < auVar82._12_4_);
            auVar105._4_4_ = iVar159;
            auVar105._0_4_ = iVar159;
            auVar105._8_4_ = iVar163;
            auVar105._12_4_ = iVar163;
            auVar64 = pshuflw(in_XMM5,auVar105,0xe8);
            auVar95._4_4_ = -(uint)(auVar82._4_4_ == iVar25);
            auVar95._12_4_ = -(uint)(auVar82._12_4_ == iVar27);
            auVar95._0_4_ = auVar95._4_4_;
            auVar95._8_4_ = auVar95._12_4_;
            auVar132 = pshuflw(in_XMM6,auVar95,0xe8);
            auVar128._0_4_ = auVar128._4_4_;
            auVar128._8_4_ = auVar128._12_4_;
            auVar82 = pshuflw(auVar64,auVar128,0xe8);
            auVar82 = (auVar82 | auVar132 & auVar64) ^ auVar137;
            auVar82 = packssdw(auVar82,auVar82);
            if ((auVar82 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(char *)(lVar55 + uVar51 * 4 + -0x3c) = cVar14;
            }
            auVar128 = auVar95 & auVar105 | auVar128;
            auVar82 = packssdw(auVar128,auVar128);
            auVar82 = packssdw(auVar82 ^ auVar137,auVar82 ^ auVar137);
            auVar82 = packsswb(auVar82,auVar82);
            if ((auVar82._0_4_ >> 8 & 1) != 0) {
              *(char *)(lVar55 + uVar51 * 4 + -0x38) = cVar14;
            }
            auVar82 = (auVar139 | _DAT_00123050) ^ auVar127;
            iVar159 = -(uint)(iVar22 < auVar82._0_4_);
            auVar123._4_4_ = -(uint)(iVar25 < auVar82._4_4_);
            iVar163 = -(uint)(iVar40 < auVar82._8_4_);
            auVar123._12_4_ = -(uint)(iVar27 < auVar82._12_4_);
            auVar83._4_4_ = iVar159;
            auVar83._0_4_ = iVar159;
            auVar83._8_4_ = iVar163;
            auVar83._12_4_ = iVar163;
            auVar112._4_4_ = -(uint)(auVar82._4_4_ == iVar25);
            auVar112._12_4_ = -(uint)(auVar82._12_4_ == iVar27);
            auVar112._0_4_ = auVar112._4_4_;
            auVar112._8_4_ = auVar112._12_4_;
            auVar123._0_4_ = auVar123._4_4_;
            auVar123._8_4_ = auVar123._12_4_;
            auVar82 = auVar112 & auVar83 | auVar123;
            auVar82 = packssdw(auVar82,auVar82);
            auVar82 = packssdw(auVar82 ^ auVar137,auVar82 ^ auVar137);
            auVar82 = packsswb(auVar82,auVar82);
            if ((auVar82._0_4_ >> 0x10 & 1) != 0) {
              *(char *)(lVar55 + uVar51 * 4 + -0x34) = cVar14;
            }
            auVar84 = pshufhw(auVar83,auVar83,0x84);
            auVar95 = pshufhw(auVar112,auVar112,0x84);
            auVar85 = pshufhw(auVar84,auVar123,0x84);
            auVar84 = (auVar85 | auVar95 & auVar84) ^ auVar137;
            auVar84 = packssdw(auVar84,auVar84);
            auVar84 = packsswb(auVar84,auVar84);
            if ((auVar84._0_4_ >> 0x18 & 1) != 0) {
              *(char *)(lVar55 + uVar51 * 4 + -0x30) = cVar14;
            }
            auVar84 = (auVar139 | _DAT_00123040) ^ auVar127;
            iVar159 = -(uint)(iVar22 < auVar84._0_4_);
            auVar87._4_4_ = -(uint)(iVar25 < auVar84._4_4_);
            iVar163 = -(uint)(iVar40 < auVar84._8_4_);
            auVar87._12_4_ = -(uint)(iVar27 < auVar84._12_4_);
            auVar113._4_4_ = iVar159;
            auVar113._0_4_ = iVar159;
            auVar113._8_4_ = iVar163;
            auVar113._12_4_ = iVar163;
            auVar82 = pshuflw(auVar82,auVar113,0xe8);
            auVar86._4_4_ = -(uint)(auVar84._4_4_ == iVar25);
            auVar86._12_4_ = -(uint)(auVar84._12_4_ == iVar27);
            auVar86._0_4_ = auVar86._4_4_;
            auVar86._8_4_ = auVar86._12_4_;
            auVar132 = pshuflw(auVar132 & auVar64,auVar86,0xe8);
            auVar87._0_4_ = auVar87._4_4_;
            auVar87._8_4_ = auVar87._12_4_;
            auVar64 = pshuflw(auVar82,auVar87,0xe8);
            auVar64 = (auVar64 | auVar132 & auVar82) ^ auVar137;
            auVar64 = packssdw(auVar64,auVar64);
            auVar64 = packsswb(auVar64,auVar64);
            if ((auVar64 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(char *)(lVar55 + uVar51 * 4 + -0x2c) = cVar14;
            }
            auVar87 = auVar86 & auVar113 | auVar87;
            auVar64 = packssdw(auVar87,auVar87);
            auVar64 = packssdw(auVar64 ^ auVar137,auVar64 ^ auVar137);
            auVar64 = packsswb(auVar64,auVar64);
            if ((auVar64._4_2_ >> 8 & 1) != 0) {
              *(char *)(lVar55 + uVar51 * 4 + -0x28) = cVar14;
            }
            auVar64 = (auVar139 | _DAT_00123030) ^ auVar127;
            iVar159 = -(uint)(iVar22 < auVar64._0_4_);
            auVar124._4_4_ = -(uint)(iVar25 < auVar64._4_4_);
            iVar163 = -(uint)(iVar40 < auVar64._8_4_);
            auVar124._12_4_ = -(uint)(iVar27 < auVar64._12_4_);
            auVar88._4_4_ = iVar159;
            auVar88._0_4_ = iVar159;
            auVar88._8_4_ = iVar163;
            auVar88._12_4_ = iVar163;
            auVar114._4_4_ = -(uint)(auVar64._4_4_ == iVar25);
            auVar114._12_4_ = -(uint)(auVar64._12_4_ == iVar27);
            auVar114._0_4_ = auVar114._4_4_;
            auVar114._8_4_ = auVar114._12_4_;
            auVar124._0_4_ = auVar124._4_4_;
            auVar124._8_4_ = auVar124._12_4_;
            auVar64 = auVar114 & auVar88 | auVar124;
            auVar64 = packssdw(auVar64,auVar64);
            auVar64 = packssdw(auVar64 ^ auVar137,auVar64 ^ auVar137);
            auVar64 = packsswb(auVar64,auVar64);
            if ((auVar64 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(char *)(lVar55 + uVar51 * 4 + -0x24) = cVar14;
            }
            auVar84 = pshufhw(auVar88,auVar88,0x84);
            auVar95 = pshufhw(auVar114,auVar114,0x84);
            auVar85 = pshufhw(auVar84,auVar124,0x84);
            auVar84 = (auVar85 | auVar95 & auVar84) ^ auVar137;
            auVar84 = packssdw(auVar84,auVar84);
            auVar84 = packsswb(auVar84,auVar84);
            if ((auVar84._6_2_ >> 8 & 1) != 0) {
              *(char *)(lVar55 + uVar51 * 4 + -0x20) = cVar14;
            }
            auVar84 = (auVar139 | _DAT_00123020) ^ auVar127;
            iVar159 = -(uint)(iVar22 < auVar84._0_4_);
            auVar90._4_4_ = -(uint)(iVar25 < auVar84._4_4_);
            iVar163 = -(uint)(iVar40 < auVar84._8_4_);
            auVar90._12_4_ = -(uint)(iVar27 < auVar84._12_4_);
            auVar115._4_4_ = iVar159;
            auVar115._0_4_ = iVar159;
            auVar115._8_4_ = iVar163;
            auVar115._12_4_ = iVar163;
            auVar64 = pshuflw(auVar64,auVar115,0xe8);
            auVar89._4_4_ = -(uint)(auVar84._4_4_ == iVar25);
            auVar89._12_4_ = -(uint)(auVar84._12_4_ == iVar27);
            auVar89._0_4_ = auVar89._4_4_;
            auVar89._8_4_ = auVar89._12_4_;
            auVar132 = pshuflw(auVar132 & auVar82,auVar89,0xe8);
            auVar90._0_4_ = auVar90._4_4_;
            auVar90._8_4_ = auVar90._12_4_;
            auVar82 = pshuflw(auVar64,auVar90,0xe8);
            auVar82 = (auVar82 | auVar132 & auVar64) ^ auVar137;
            auVar82 = packssdw(auVar82,auVar82);
            auVar82 = packsswb(auVar82,auVar82);
            if ((auVar82 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(char *)(lVar55 + uVar51 * 4 + -0x1c) = cVar14;
            }
            auVar90 = auVar89 & auVar115 | auVar90;
            auVar82 = packssdw(auVar90,auVar90);
            auVar82 = packssdw(auVar82 ^ auVar137,auVar82 ^ auVar137);
            auVar82 = packsswb(auVar82,auVar82);
            if ((auVar82._8_2_ >> 8 & 1) != 0) {
              *(char *)(lVar55 + uVar51 * 4 + -0x18) = cVar14;
            }
            auVar82 = (auVar139 | _DAT_00123010) ^ auVar127;
            iVar159 = -(uint)(iVar22 < auVar82._0_4_);
            auVar125._4_4_ = -(uint)(iVar25 < auVar82._4_4_);
            iVar163 = -(uint)(iVar40 < auVar82._8_4_);
            auVar125._12_4_ = -(uint)(iVar27 < auVar82._12_4_);
            auVar91._4_4_ = iVar159;
            auVar91._0_4_ = iVar159;
            auVar91._8_4_ = iVar163;
            auVar91._12_4_ = iVar163;
            auVar116._4_4_ = -(uint)(auVar82._4_4_ == iVar25);
            auVar116._12_4_ = -(uint)(auVar82._12_4_ == iVar27);
            auVar116._0_4_ = auVar116._4_4_;
            auVar116._8_4_ = auVar116._12_4_;
            auVar125._0_4_ = auVar125._4_4_;
            auVar125._8_4_ = auVar125._12_4_;
            auVar82 = auVar116 & auVar91 | auVar125;
            auVar82 = packssdw(auVar82,auVar82);
            auVar82 = packssdw(auVar82 ^ auVar137,auVar82 ^ auVar137);
            auVar82 = packsswb(auVar82,auVar82);
            if ((auVar82 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(char *)(lVar55 + uVar51 * 4 + -0x14) = cVar14;
            }
            auVar84 = pshufhw(auVar91,auVar91,0x84);
            auVar95 = pshufhw(auVar116,auVar116,0x84);
            auVar85 = pshufhw(auVar84,auVar125,0x84);
            auVar84 = (auVar85 | auVar95 & auVar84) ^ auVar137;
            auVar84 = packssdw(auVar84,auVar84);
            auVar84 = packsswb(auVar84,auVar84);
            if ((auVar84._10_2_ >> 8 & 1) != 0) {
              *(char *)(lVar55 + uVar51 * 4 + -0x10) = cVar14;
            }
            auVar84 = (auVar139 | _DAT_00123000) ^ auVar127;
            iVar159 = -(uint)(iVar22 < auVar84._0_4_);
            auVar93._4_4_ = -(uint)(iVar25 < auVar84._4_4_);
            iVar163 = -(uint)(iVar40 < auVar84._8_4_);
            auVar93._12_4_ = -(uint)(iVar27 < auVar84._12_4_);
            auVar117._4_4_ = iVar159;
            auVar117._0_4_ = iVar159;
            auVar117._8_4_ = iVar163;
            auVar117._12_4_ = iVar163;
            auVar82 = pshuflw(auVar82,auVar117,0xe8);
            auVar92._4_4_ = -(uint)(auVar84._4_4_ == iVar25);
            auVar92._12_4_ = -(uint)(auVar84._12_4_ == iVar27);
            auVar92._0_4_ = auVar92._4_4_;
            auVar92._8_4_ = auVar92._12_4_;
            in_XMM6 = pshuflw(auVar132 & auVar64,auVar92,0xe8);
            in_XMM6 = in_XMM6 & auVar82;
            auVar93._0_4_ = auVar93._4_4_;
            auVar93._8_4_ = auVar93._12_4_;
            auVar64 = pshuflw(auVar82,auVar93,0xe8);
            auVar64 = (auVar64 | in_XMM6) ^ auVar137;
            auVar64 = packssdw(auVar64,auVar64);
            in_XMM5 = packsswb(auVar64,auVar64);
            if ((in_XMM5 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(char *)(lVar55 + uVar51 * 4 + -0xc) = cVar14;
            }
            auVar93 = auVar92 & auVar117 | auVar93;
            auVar64 = packssdw(auVar93,auVar93);
            auVar64 = packssdw(auVar64 ^ auVar137,auVar64 ^ auVar137);
            auVar64 = packsswb(auVar64,auVar64);
            if ((auVar64._12_2_ >> 8 & 1) != 0) {
              *(char *)(lVar55 + uVar51 * 4 + -8) = cVar14;
            }
            auVar64 = (auVar139 | _DAT_00122ff0) ^ auVar127;
            auVar118._0_4_ = -(uint)(iVar22 < auVar64._0_4_);
            auVar118._4_4_ = -(uint)(iVar25 < auVar64._4_4_);
            auVar118._8_4_ = -(uint)(iVar40 < auVar64._8_4_);
            auVar118._12_4_ = -(uint)(iVar27 < auVar64._12_4_);
            auVar94._4_4_ = auVar118._0_4_;
            auVar94._0_4_ = auVar118._0_4_;
            auVar94._8_4_ = auVar118._8_4_;
            auVar94._12_4_ = auVar118._8_4_;
            auVar61._4_4_ = -(uint)(auVar64._4_4_ == iVar25);
            auVar61._12_4_ = -(uint)(auVar64._12_4_ == iVar27);
            auVar61._0_4_ = auVar61._4_4_;
            auVar61._8_4_ = auVar61._12_4_;
            auVar65._4_4_ = auVar118._4_4_;
            auVar65._0_4_ = auVar118._4_4_;
            auVar65._8_4_ = auVar118._12_4_;
            auVar65._12_4_ = auVar118._12_4_;
            auVar64 = packssdw(auVar118,auVar61 & auVar94 | auVar65);
            auVar64 = packssdw(auVar64 ^ auVar137,auVar64 ^ auVar137);
            auVar64 = packsswb(auVar64,auVar64);
            if ((auVar64 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(char *)(lVar55 + uVar51 * 4 + -4) = cVar14;
            }
            auVar132 = pshufhw(auVar94,auVar94,0x84);
            auVar64 = pshufhw(auVar61,auVar61,0x84);
            auVar82 = pshufhw(auVar65,auVar65,0x84);
            auVar64 = packssdw(auVar64 & auVar132,(auVar82 | auVar64 & auVar132) ^ auVar137);
            auVar64 = packsswb(auVar64,auVar64);
            if ((auVar64._14_2_ >> 8 & 1) != 0) {
              *(char *)(lVar55 + uVar51 * 4) = cVar14;
            }
            uVar51 = uVar51 + 0x10;
          } while ((uVar24 + 0xf & 0xfffffff0) != uVar51);
        }
        uVar57 = uVar57 + 1;
        lVar55 = lVar55 + 1;
        local_9778 = (void *)((long)local_9778 + 1);
        local_9788 = (void *)((long)local_9788 + 2);
      } while (uVar57 != 4);
      goto LAB_0010ec4e;
    }
    stbi__skip(s,(uint)bVar19 * (int)local_96e0 * 2);
    lVar55 = uVar56 - 1;
    auVar133._8_4_ = (int)lVar55;
    auVar133._0_8_ = lVar55;
    auVar133._12_4_ = (int)((ulong)lVar55 >> 0x20);
    lVar55 = (long)pvVar33 + 0x3c;
    uVar57 = 0;
    auVar127 = _DAT_00122ff0;
    auVar64 = _DAT_00123000;
    auVar82 = _DAT_00123010;
    auVar132 = _DAT_00123020;
    auVar84 = _DAT_00123030;
    auVar85 = _DAT_00123040;
    auVar60 = _DAT_00123050;
    auVar137 = _DAT_00123060;
    goto LAB_0010e74b;
  }
  stbi__get32le(s);
  stbi__get8(s);
  stbi__get8(s);
  stbi__get8(s);
  stbi__get8(s);
  stbi__get32le(s);
  sVar20 = stbi__get32le(s);
  if (((sVar20 < 0x39) && ((0x100010000001000U >> ((ulong)sVar20 & 0x3f) & 1) != 0)) ||
     (sVar20 == 0x6c)) {
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
  }
  else {
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    if (sVar20 != 0x7c) goto LAB_0010d196;
  }
  sVar9 = stbi__get8(s);
  if ((sVar9 != 'B') || (sVar9 = stbi__get8(s), sVar9 != 'M')) {
    pcVar31 = "not BMP";
    goto LAB_0010f021;
  }
  stbi__get32le(s);
  stbi__get8(s);
  stbi__get8(s);
  stbi__get8(s);
  stbi__get8(s);
  sVar20 = stbi__get32le(s);
  sVar21 = stbi__get32le(s);
  if (-1 < (int)sVar20) {
    if ((int)sVar21 < 0x38) {
      if (sVar21 != 0xc) {
        if (sVar21 != 0x28) goto LAB_0010e44a;
        goto LAB_0010d077;
      }
      local_96e8 = comp;
      sVar9 = stbi__get8(s);
      sVar12 = stbi__get8(s);
      s->img_x = (uint)CONCAT11(sVar12,sVar9);
      sVar9 = stbi__get8(s);
      sVar12 = stbi__get8(s);
      sVar23 = (stbi__uint32)CONCAT11(sVar12,sVar9);
    }
    else {
      if (((sVar21 != 0x38) && (sVar21 != 0x6c)) && (sVar21 != 0x7c)) {
LAB_0010e44a:
        pcVar31 = "unknown BMP";
        goto LAB_0010f021;
      }
LAB_0010d077:
      local_96e8 = comp;
      sVar23 = stbi__get32le(s);
      s->img_x = sVar23;
      sVar23 = stbi__get32le(s);
    }
    s->img_y = sVar23;
    sVar9 = stbi__get8(s);
    sVar12 = stbi__get8(s);
    if (CONCAT11(sVar12,sVar9) == 1) {
      sVar9 = stbi__get8(s);
      sVar12 = stbi__get8(s);
      uVar37 = CONCAT11(sVar12,sVar9);
      sVar23 = 0;
      local_9768._0_4_ = 0xff;
      iVar22 = -0xe;
      if (sVar21 == 0xc) {
        local_9798._0_4_ = 0;
        local_9748._0_4_ = 0;
        uVar35 = 0;
        goto LAB_0010d116;
      }
      sVar26 = stbi__get32le(s);
      if (sVar26 - 1 < 2) {
        pcVar31 = "BMP RLE";
        goto LAB_0010f021;
      }
      if (3 < (int)sVar26) {
        pcVar31 = "BMP JPEG/PNG";
        goto LAB_0010f021;
      }
      if (((sVar26 == 3) && (uVar37 != 0x10)) && (uVar37 != 0x20)) goto LAB_0010f01a;
      stbi__get32le(s);
      stbi__get32le(s);
      stbi__get32le(s);
      stbi__get32le(s);
      stbi__get32le(s);
      if (0x6b < (int)sVar21) {
        if ((sVar21 != 0x6c) && (sVar21 != 0x7c)) goto LAB_0010f01a;
        local_9798._0_4_ = stbi__get32le(s);
        local_9748._0_4_ = stbi__get32le(s);
        uVar35 = stbi__get32le(s);
        sVar23 = stbi__get32le(s);
        local_9768._0_4_ = 0xff;
        if (sVar26 == 0) {
          if (uVar37 == 0x10) {
            uVar35 = 0x1f;
            local_9748._0_4_ = 0x3e0;
            local_9798._0_4_ = 0x7c00;
          }
          else if (uVar37 == 0x20) {
            sVar23 = 0xff000000;
            local_9768._0_4_ = 0;
            uVar35 = 0xff;
            local_9748._0_4_ = 0xff00;
            local_9798._0_4_ = 0xff0000;
          }
          else {
            local_9798._0_4_ = 0;
            local_9748._0_4_ = 0;
            uVar35 = 0;
            sVar23 = 0;
          }
        }
        stbi__get32le(s);
        iVar22 = 0xc;
        do {
          stbi__get32le(s);
          iVar22 = iVar22 + -1;
        } while (iVar22 != 0);
        if (sVar21 != 0x6c) {
          if (sVar21 != 0x7c) {
            return (void *)0x0;
          }
          stbi__get32le(s);
          stbi__get32le(s);
          stbi__get32le(s);
          stbi__get32le(s);
        }
LAB_0010f83c:
        iVar22 = -0xe;
LAB_0010d116:
        uVar24 = s->img_y;
        uVar54 = -uVar24;
        if (0 < (int)uVar24) {
          uVar54 = uVar24;
        }
        s->img_y = uVar54;
        if ((uVar54 < 0x1000001) && (s->img_x < 0x1000001)) {
          local_96f0 = (stbi__uint32 *)x;
          if (sVar21 == 0xc) {
            if (0x17 < uVar37) goto LAB_0010ef33;
            uVar54 = (int)(sVar20 + iVar22 + -0x18) / 3;
LAB_0010ee71:
            local_9770 = (ulong)uVar54;
            if (uVar54 == 0) goto LAB_0010ef33;
            local_96d0 = (stbi__uint32 *)y;
            bVar15 = false;
LAB_0010eea2:
            bVar1 = bVar15;
            bVar15 = sVar23 == 0xff000000;
            iVar25 = 4 - (uint)(sVar23 == 0);
          }
          else {
            if (uVar37 < 0x10) {
              uVar54 = (int)((sVar20 - sVar21) + iVar22) >> 2;
              goto LAB_0010ee71;
            }
LAB_0010ef33:
            iVar25 = (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original) +
                     s->callback_already_read;
            if (iVar25 - 0x401U < 0xfffffc00) {
              pcVar31 = "bad header";
              goto LAB_0010f021;
            }
            if (((int)sVar20 < iVar25) || (0x400 < (int)(sVar20 - iVar25))) {
              pcVar31 = "bad offset";
              goto LAB_0010f021;
            }
            local_96d0 = (stbi__uint32 *)y;
            stbi__skip(s,sVar20 - iVar25);
            local_9770 = 0;
            bVar15 = true;
            iVar25 = 3;
            bVar1 = true;
            if (uVar37 != 0x18 || sVar23 != 0xff000000) goto LAB_0010eea2;
          }
          s->img_n = iVar25;
          sVar26 = s->img_x;
          c = s->img_y;
          iVar25 = stbi__mad3sizes_valid(4,sVar26,c,0);
          if (iVar25 != 0) {
            pvVar33 = stbi__malloc_mad3(4,sVar26,c,0);
            if (pvVar33 != (void *)0x0) {
              local_96bc = uVar24;
              if (uVar37 < 0x10) {
                if (bVar1 || 0x100 < (int)local_9770) {
                  free(pvVar33);
                  pcVar31 = "invalid";
                  goto LAB_0010f021;
                }
                if (0 < (int)local_9770) {
                  uVar56 = 0;
                  do {
                    sVar9 = stbi__get8(s);
                    local_9088[uVar56 * 4 + 2] = sVar9;
                    sVar9 = stbi__get8(s);
                    local_9088[uVar56 * 4 + 1] = sVar9;
                    sVar9 = stbi__get8(s);
                    local_9088[uVar56 * 4] = sVar9;
                    if (sVar21 != 0xc) {
                      stbi__get8(s);
                    }
                    local_9088[uVar56 * 4 + 3] = 0xff;
                    uVar56 = uVar56 + 1;
                  } while (local_9770 != uVar56);
                }
                stbi__skip(s,(sVar20 - sVar21) + iVar22 +
                             (int)local_9770 * (sVar21 == 0xc | 0xfffffffc));
                if (uVar37 == 1) {
                  sVar20 = s->img_y;
                  if (0 < (int)sVar20) {
                    sVar21 = s->img_x;
                    iVar22 = 0;
                    iVar25 = 0;
                    do {
                      bVar19 = stbi__get8(s);
                      sVar20 = s->img_x;
                      if (0 < (int)sVar20) {
                        uVar35 = (uint)bVar19;
                        lVar53 = (long)iVar22;
                        uVar24 = 7;
                        lVar55 = 0;
                        do {
                          iVar22 = iVar22 + 4;
                          uVar56 = (ulong)((uVar35 >> (uVar24 & 0x1f) & 1) != 0);
                          *(undefined1 *)((long)pvVar33 + lVar55 * 4 + lVar53) =
                               local_9088[uVar56 * 4];
                          *(undefined1 *)((long)pvVar33 + lVar55 * 4 + lVar53 + 1U) =
                               local_9088[uVar56 * 4 + 1];
                          *(undefined1 *)((long)pvVar33 + lVar55 * 4 + lVar53 + 2U) =
                               local_9088[uVar56 * 4 + 2];
                          *(undefined1 *)((long)pvVar33 + lVar55 * 4 + lVar53 + 3U) = 0xff;
                          if ((int)lVar55 + 1U == sVar20) break;
                          if ((int)uVar24 < 1) {
                            bVar19 = stbi__get8(s);
                            uVar35 = (uint)bVar19;
                            sVar20 = s->img_x;
                            uVar24 = 7;
                          }
                          else {
                            uVar24 = uVar24 - 1;
                          }
                          lVar55 = lVar55 + 1;
                        } while ((int)lVar55 < (int)sVar20);
                      }
                      stbi__skip(s,-(sVar21 + 7 >> 3) & 3);
                      iVar25 = iVar25 + 1;
                      sVar20 = s->img_y;
                    } while (iVar25 < (int)sVar20);
                  }
                }
                else {
                  if (uVar37 == 8) {
                    uVar35 = s->img_x;
                  }
                  else {
                    if (uVar37 != 4) {
                      free(pvVar33);
                      pcVar31 = "bad bpp";
                      goto LAB_0010f021;
                    }
                    uVar35 = s->img_x + 1 >> 1;
                  }
                  sVar20 = s->img_y;
                  if (0 < (int)sVar20) {
                    iVar25 = 0;
                    iVar22 = 0;
                    do {
                      if (0 < (int)s->img_x) {
                        lVar55 = (long)iVar25;
                        lVar53 = 0;
                        iVar40 = 0;
                        do {
                          bVar10 = stbi__get8(s);
                          bVar19 = bVar10 >> 4;
                          if (uVar37 != 4) {
                            bVar19 = bVar10;
                          }
                          uVar56 = (ulong)bVar19;
                          *(undefined1 *)((long)pvVar33 + lVar53 * 4 + lVar55) =
                               local_9088[uVar56 * 4];
                          *(undefined1 *)((long)pvVar33 + lVar53 * 4 + lVar55 + 1U) =
                               local_9088[uVar56 * 4 + 1];
                          *(undefined1 *)((long)pvVar33 + lVar53 * 4 + lVar55 + 2U) =
                               local_9088[uVar56 * 4 + 2];
                          *(undefined1 *)((long)pvVar33 + lVar53 * 4 + lVar55 + 3U) = 0xff;
                          sVar20 = s->img_x;
                          if ((int)lVar53 + 1U == sVar20) {
                            iVar25 = (iVar25 - iVar40) + 4;
                            goto LAB_0011042c;
                          }
                          uVar24 = bVar10 & 0xf;
                          if (uVar37 != 4) {
                            uVar24 = 0;
                          }
                          if (uVar37 == 8) {
                            bVar19 = stbi__get8(s);
                            uVar24 = (uint)bVar19;
                            sVar20 = s->img_x;
                          }
                          uVar56 = (ulong)uVar24;
                          *(undefined1 *)((long)pvVar33 + lVar53 * 4 + lVar55 + 4U) =
                               local_9088[uVar56 * 4];
                          *(undefined1 *)((long)pvVar33 + lVar53 * 4 + lVar55 + 5U) =
                               local_9088[uVar56 * 4 + 1];
                          *(undefined1 *)((long)pvVar33 + lVar53 * 4 + lVar55 + 6U) =
                               local_9088[uVar56 * 4 + 2];
                          *(undefined1 *)((long)pvVar33 + lVar53 * 4 + lVar55 + 7U) = 0xff;
                          iVar40 = iVar40 + -8;
                          lVar53 = lVar53 + 2;
                        } while ((int)lVar53 < (int)sVar20);
                        iVar25 = iVar25 - iVar40;
                      }
LAB_0011042c:
                      stbi__skip(s,-uVar35 & 3);
                      iVar22 = iVar22 + 1;
                      sVar20 = s->img_y;
                    } while (iVar22 < (int)sVar20);
                  }
                }
                goto LAB_0011052c;
              }
              stbi__skip(s,(sVar20 - sVar21) + iVar22);
              uVar24 = local_96b8._4_4_;
              if (uVar37 != 0x10) {
                if (uVar37 == 0x20) {
                  uVar24 = (stbi__uint32)local_9798 ^ 0xff0000 |
                           local_9748._0_4_ ^ 0xff00 | uVar35 ^ 0xff;
                  local_96b8 = (ulong)local_96b8._4_4_ << 0x20;
                  if ((bool)(uVar24 == 0 & bVar15)) {
                    local_9698 = CONCAT44(local_9698._4_4_,
                                          (int)CONCAT71((uint7)(uint3)(uVar24 >> 8),1));
                    goto LAB_0010fc40;
                  }
                  goto LAB_0010fcb2;
                }
                local_96b8 = (ulong)local_96b8._4_4_ << 0x20;
                if (uVar37 != 0x18) goto LAB_0010fcb2;
                local_96b8 = CONCAT44(uVar24,s->img_x) & 0xffffffff00000003;
                local_9698 = (ulong)local_9698._4_4_ << 0x20;
LAB_0010fc40:
                local_96f8 = (stbi_uc *)((ulong)local_96f8 & 0xffffffff00000000);
                iVar22 = 0;
                iVar25 = 0;
                iVar40 = 0;
                local_96b0 = (stbi_uc *)((ulong)local_96b0 & 0xffffffff00000000);
                local_9700 = local_9700 & 0xffffffff00000000;
                local_96d8 = (stbi__context *)((ulong)local_96d8 & 0xffffffff00000000);
                local_96e0 = local_96e0 & 0xffffffff00000000;
                local_96a0 = (stbi__context *)((ulong)local_96a0 & 0xffffffff00000000);
LAB_0011014f:
                sVar20 = s->img_y;
                if (0 < (int)sVar20) {
                  local_96c8 = (stbi_uc *)((long)pvVar33 + 3);
                  iVar159 = 0;
                  iVar27 = 0;
                  do {
                    psVar32 = local_96c8;
                    iVar163 = iVar27;
                    if ((char)local_96f8 == '\0') {
                      if (0 < (int)s->img_x) {
                        lVar55 = 0;
                        do {
                          sVar9 = stbi__get8(s);
                          *(stbi_uc *)((long)psVar32 + lVar55 * 4 + (long)iVar27 + -1) = sVar9;
                          sVar9 = stbi__get8(s);
                          *(stbi_uc *)((long)psVar32 + lVar55 * 4 + (long)iVar27 + -2) = sVar9;
                          sVar9 = stbi__get8(s);
                          *(stbi_uc *)((long)psVar32 + lVar55 * 4 + (long)iVar27 + -3) = sVar9;
                          bVar19 = 0xff;
                          if ((char)local_9698 != '\0') {
                            bVar19 = stbi__get8(s);
                          }
                          local_9768._0_4_ = local_9768._0_4_ | (uint)bVar19;
                          *(byte *)((long)psVar32 + lVar55 * 4 + (long)iVar27) = bVar19;
                          iVar163 = iVar163 + 4;
                          lVar55 = lVar55 + 1;
                        } while ((int)lVar55 < (int)s->img_x);
                      }
                    }
                    else if (0 < (int)s->img_x) {
                      lVar55 = 0;
                      do {
                        if (uVar37 == 0x10) {
                          sVar9 = stbi__get8(s);
                          sVar12 = stbi__get8(s);
                          sVar20 = (stbi__uint32)CONCAT11(sVar12,sVar9);
                        }
                        else {
                          sVar20 = stbi__get32le(s);
                        }
                        iVar28 = stbi__shiftsigned(sVar20 & (stbi__uint32)local_9798,iVar22,
                                                   (uint)local_9700);
                        *(char *)((long)psVar32 + lVar55 * 4 + (long)iVar27 + -3) = (char)iVar28;
                        iVar28 = stbi__shiftsigned(sVar20 & local_9748._0_4_,iVar25,(int)local_96d8)
                        ;
                        *(char *)((long)psVar32 + lVar55 * 4 + (long)iVar27 + -2) = (char)iVar28;
                        iVar28 = stbi__shiftsigned(sVar20 & uVar35,iVar40,(int)local_96e0);
                        *(char *)((long)psVar32 + lVar55 * 4 + (long)iVar27 + -1) = (char)iVar28;
                        if (sVar23 == 0) {
                          uVar24 = 0xff;
                        }
                        else {
                          uVar24 = stbi__shiftsigned(sVar20 & sVar23,(int)local_96b0,(int)local_96a0
                                                    );
                        }
                        local_9768._0_4_ = local_9768._0_4_ | uVar24;
                        *(char *)((long)psVar32 + lVar55 * 4 + (long)iVar27) = (char)uVar24;
                        iVar163 = iVar163 + 4;
                        lVar55 = lVar55 + 1;
                      } while ((int)lVar55 < (int)s->img_x);
                    }
                    stbi__skip(s,(int)local_96b8);
                    iVar159 = iVar159 + 1;
                    sVar20 = s->img_y;
                    iVar27 = iVar163;
                  } while (iVar159 < (int)sVar20);
                }
LAB_0011052c:
                auVar60 = _DAT_00123060;
                auVar85 = _DAT_00123050;
                auVar84 = _DAT_00123040;
                auVar132 = _DAT_00123030;
                auVar82 = _DAT_00123020;
                auVar64 = _DAT_00123010;
                auVar127 = _DAT_00122280;
                if ((local_9768._0_4_ == 0) &&
                   (uVar35 = s->img_x * sVar20 * 4 - 1, -1 < (int)uVar35)) {
                  uVar24 = uVar35 >> 2;
                  auVar62._4_4_ = 0;
                  auVar62._0_4_ = uVar24;
                  auVar62._8_4_ = uVar24;
                  auVar62._12_4_ = 0;
                  puVar36 = (undefined1 *)((long)pvVar33 + (ulong)uVar35);
                  uVar56 = 0;
                  auVar134._8_4_ = 0xffffffff;
                  auVar134._0_8_ = 0xffffffffffffffff;
                  auVar134._12_4_ = 0xffffffff;
                  do {
                    auVar135._8_4_ = (int)uVar56;
                    auVar135._0_8_ = uVar56;
                    auVar135._12_4_ = (int)(uVar56 >> 0x20);
                    auVar137 = auVar62 | auVar127;
                    auVar139 = (auVar135 | auVar60) ^ auVar127;
                    iVar22 = auVar137._0_4_;
                    iVar159 = -(uint)(iVar22 < auVar139._0_4_);
                    iVar25 = auVar137._4_4_;
                    auVar141._4_4_ = -(uint)(iVar25 < auVar139._4_4_);
                    iVar40 = auVar137._8_4_;
                    iVar163 = -(uint)(iVar40 < auVar139._8_4_);
                    iVar27 = auVar137._12_4_;
                    auVar141._12_4_ = -(uint)(iVar27 < auVar139._12_4_);
                    auVar152._4_4_ = iVar159;
                    auVar152._0_4_ = iVar159;
                    auVar152._8_4_ = iVar163;
                    auVar152._12_4_ = iVar163;
                    auVar137 = pshuflw(in_XMM1,auVar152,0xe8);
                    auVar140._4_4_ = -(uint)(auVar139._4_4_ == iVar25);
                    auVar140._12_4_ = -(uint)(auVar139._12_4_ == iVar27);
                    auVar140._0_4_ = auVar140._4_4_;
                    auVar140._8_4_ = auVar140._12_4_;
                    auVar95 = pshuflw(in_XMM2,auVar140,0xe8);
                    auVar141._0_4_ = auVar141._4_4_;
                    auVar141._8_4_ = auVar141._12_4_;
                    auVar139 = pshuflw(auVar137,auVar141,0xe8);
                    auVar137 = (auVar139 | auVar95 & auVar137) ^ auVar134;
                    auVar137 = packssdw(auVar137,auVar137);
                    if ((auVar137 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *puVar36 = 0xff;
                    }
                    auVar141 = auVar140 & auVar152 | auVar141;
                    auVar137 = packssdw(auVar141,auVar141);
                    auVar137 = packssdw(auVar137 ^ auVar134,auVar137 ^ auVar134);
                    auVar137 = packsswb(auVar137,auVar137);
                    if ((auVar137._0_4_ >> 8 & 1) != 0) {
                      puVar36[-4] = 0xff;
                    }
                    auVar137 = (auVar135 | auVar85) ^ auVar127;
                    auVar96._0_4_ = -(uint)(iVar22 < auVar137._0_4_);
                    auVar96._4_4_ = -(uint)(iVar25 < auVar137._4_4_);
                    auVar96._8_4_ = -(uint)(iVar40 < auVar137._8_4_);
                    auVar96._12_4_ = -(uint)(iVar27 < auVar137._12_4_);
                    auVar142._4_4_ = auVar96._0_4_;
                    auVar142._0_4_ = auVar96._0_4_;
                    auVar142._8_4_ = auVar96._8_4_;
                    auVar142._12_4_ = auVar96._8_4_;
                    iVar159 = -(uint)(auVar137._4_4_ == iVar25);
                    iVar163 = -(uint)(auVar137._12_4_ == iVar27);
                    auVar153._4_4_ = iVar159;
                    auVar153._0_4_ = iVar159;
                    auVar153._8_4_ = iVar163;
                    auVar153._12_4_ = iVar163;
                    auVar160._4_4_ = auVar96._4_4_;
                    auVar160._0_4_ = auVar96._4_4_;
                    auVar160._8_4_ = auVar96._12_4_;
                    auVar160._12_4_ = auVar96._12_4_;
                    auVar137 = auVar153 & auVar142 | auVar160;
                    auVar137 = packssdw(auVar137,auVar137);
                    auVar137 = packssdw(auVar137 ^ auVar134,auVar137 ^ auVar134);
                    auVar137 = packsswb(auVar137,auVar137);
                    if ((auVar137._0_4_ >> 0x10 & 1) != 0) {
                      puVar36[-8] = 0xff;
                    }
                    auVar137 = pshufhw(auVar137,auVar142,0x84);
                    auVar95 = pshufhw(auVar96,auVar153,0x84);
                    auVar139 = pshufhw(auVar137,auVar160,0x84);
                    auVar137 = (auVar139 | auVar95 & auVar137) ^ auVar134;
                    auVar137 = packssdw(auVar137,auVar137);
                    auVar137 = packsswb(auVar137,auVar137);
                    if ((auVar137._0_4_ >> 0x18 & 1) != 0) {
                      puVar36[-0xc] = 0xff;
                    }
                    auVar137 = (auVar135 | auVar84) ^ auVar127;
                    auVar97._0_4_ = -(uint)(iVar22 < auVar137._0_4_);
                    auVar97._4_4_ = -(uint)(iVar25 < auVar137._4_4_);
                    auVar97._8_4_ = -(uint)(iVar40 < auVar137._8_4_);
                    auVar97._12_4_ = -(uint)(iVar27 < auVar137._12_4_);
                    auVar154._4_4_ = auVar97._0_4_;
                    auVar154._0_4_ = auVar97._0_4_;
                    auVar154._8_4_ = auVar97._8_4_;
                    auVar154._12_4_ = auVar97._8_4_;
                    auVar95 = pshuflw(auVar160,auVar154,0xe8);
                    auVar66._0_4_ = -(uint)(auVar137._0_4_ == iVar22);
                    auVar66._4_4_ = -(uint)(auVar137._4_4_ == iVar25);
                    auVar66._8_4_ = -(uint)(auVar137._8_4_ == iVar40);
                    auVar66._12_4_ = -(uint)(auVar137._12_4_ == iVar27);
                    auVar143._4_4_ = auVar66._4_4_;
                    auVar143._0_4_ = auVar66._4_4_;
                    auVar143._8_4_ = auVar66._12_4_;
                    auVar143._12_4_ = auVar66._12_4_;
                    auVar137 = pshuflw(auVar66,auVar143,0xe8);
                    auVar144._4_4_ = auVar97._4_4_;
                    auVar144._0_4_ = auVar97._4_4_;
                    auVar144._8_4_ = auVar97._12_4_;
                    auVar144._12_4_ = auVar97._12_4_;
                    auVar139 = pshuflw(auVar97,auVar144,0xe8);
                    auVar137 = packssdw(auVar137 & auVar95,
                                        (auVar139 | auVar137 & auVar95) ^ auVar134);
                    auVar137 = packsswb(auVar137,auVar137);
                    if ((auVar137 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      puVar36[-0x10] = 0xff;
                    }
                    auVar144 = auVar143 & auVar154 | auVar144;
                    auVar139 = packssdw(auVar144,auVar144);
                    auVar137 = packssdw(auVar137,auVar139 ^ auVar134);
                    auVar137 = packsswb(auVar137,auVar137);
                    if ((auVar137._4_2_ >> 8 & 1) != 0) {
                      puVar36[-0x14] = 0xff;
                    }
                    auVar137 = (auVar135 | auVar132) ^ auVar127;
                    auVar98._0_4_ = -(uint)(iVar22 < auVar137._0_4_);
                    auVar98._4_4_ = -(uint)(iVar25 < auVar137._4_4_);
                    auVar98._8_4_ = -(uint)(iVar40 < auVar137._8_4_);
                    auVar98._12_4_ = -(uint)(iVar27 < auVar137._12_4_);
                    auVar145._4_4_ = auVar98._0_4_;
                    auVar145._0_4_ = auVar98._0_4_;
                    auVar145._8_4_ = auVar98._8_4_;
                    auVar145._12_4_ = auVar98._8_4_;
                    iVar159 = -(uint)(auVar137._4_4_ == iVar25);
                    iVar163 = -(uint)(auVar137._12_4_ == iVar27);
                    auVar155._4_4_ = iVar159;
                    auVar155._0_4_ = iVar159;
                    auVar155._8_4_ = iVar163;
                    auVar155._12_4_ = iVar163;
                    auVar161._4_4_ = auVar98._4_4_;
                    auVar161._0_4_ = auVar98._4_4_;
                    auVar161._8_4_ = auVar98._12_4_;
                    auVar161._12_4_ = auVar98._12_4_;
                    auVar137 = auVar155 & auVar145 | auVar161;
                    auVar137 = packssdw(auVar137,auVar137);
                    auVar137 = packssdw(auVar137 ^ auVar134,auVar137 ^ auVar134);
                    auVar137 = packsswb(auVar137,auVar137);
                    if ((auVar137 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      puVar36[-0x18] = 0xff;
                    }
                    auVar137 = pshufhw(auVar137,auVar145,0x84);
                    auVar95 = pshufhw(auVar98,auVar155,0x84);
                    auVar139 = pshufhw(auVar137,auVar161,0x84);
                    auVar137 = (auVar139 | auVar95 & auVar137) ^ auVar134;
                    auVar137 = packssdw(auVar137,auVar137);
                    auVar137 = packsswb(auVar137,auVar137);
                    if ((auVar137._6_2_ >> 8 & 1) != 0) {
                      puVar36[-0x1c] = 0xff;
                    }
                    auVar137 = (auVar135 | auVar82) ^ auVar127;
                    auVar99._0_4_ = -(uint)(iVar22 < auVar137._0_4_);
                    auVar99._4_4_ = -(uint)(iVar25 < auVar137._4_4_);
                    auVar99._8_4_ = -(uint)(iVar40 < auVar137._8_4_);
                    auVar99._12_4_ = -(uint)(iVar27 < auVar137._12_4_);
                    auVar156._4_4_ = auVar99._0_4_;
                    auVar156._0_4_ = auVar99._0_4_;
                    auVar156._8_4_ = auVar99._8_4_;
                    auVar156._12_4_ = auVar99._8_4_;
                    auVar95 = pshuflw(auVar161,auVar156,0xe8);
                    auVar67._0_4_ = -(uint)(auVar137._0_4_ == iVar22);
                    auVar67._4_4_ = -(uint)(auVar137._4_4_ == iVar25);
                    auVar67._8_4_ = -(uint)(auVar137._8_4_ == iVar40);
                    auVar67._12_4_ = -(uint)(auVar137._12_4_ == iVar27);
                    auVar146._4_4_ = auVar67._4_4_;
                    auVar146._0_4_ = auVar67._4_4_;
                    auVar146._8_4_ = auVar67._12_4_;
                    auVar146._12_4_ = auVar67._12_4_;
                    auVar137 = pshuflw(auVar67,auVar146,0xe8);
                    auVar147._4_4_ = auVar99._4_4_;
                    auVar147._0_4_ = auVar99._4_4_;
                    auVar147._8_4_ = auVar99._12_4_;
                    auVar147._12_4_ = auVar99._12_4_;
                    auVar139 = pshuflw(auVar99,auVar147,0xe8);
                    auVar139 = (auVar139 | auVar137 & auVar95) ^ auVar134;
                    auVar139 = packssdw(auVar139,auVar139);
                    auVar137 = packsswb(auVar137 & auVar95,auVar139);
                    if ((auVar137 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      puVar36[-0x20] = 0xff;
                    }
                    auVar147 = auVar146 & auVar156 | auVar147;
                    auVar139 = packssdw(auVar147,auVar147);
                    auVar139 = packssdw(auVar139 ^ auVar134,auVar139 ^ auVar134);
                    auVar137 = packsswb(auVar137,auVar139);
                    if ((auVar137._8_2_ >> 8 & 1) != 0) {
                      puVar36[-0x24] = 0xff;
                    }
                    auVar137 = (auVar135 | auVar64) ^ auVar127;
                    auVar100._0_4_ = -(uint)(iVar22 < auVar137._0_4_);
                    auVar100._4_4_ = -(uint)(iVar25 < auVar137._4_4_);
                    auVar100._8_4_ = -(uint)(iVar40 < auVar137._8_4_);
                    auVar100._12_4_ = -(uint)(iVar27 < auVar137._12_4_);
                    auVar148._4_4_ = auVar100._0_4_;
                    auVar148._0_4_ = auVar100._0_4_;
                    auVar148._8_4_ = auVar100._8_4_;
                    auVar148._12_4_ = auVar100._8_4_;
                    iVar159 = -(uint)(auVar137._4_4_ == iVar25);
                    iVar163 = -(uint)(auVar137._12_4_ == iVar27);
                    auVar157._4_4_ = iVar159;
                    auVar157._0_4_ = iVar159;
                    auVar157._8_4_ = iVar163;
                    auVar157._12_4_ = iVar163;
                    auVar162._4_4_ = auVar100._4_4_;
                    auVar162._0_4_ = auVar100._4_4_;
                    auVar162._8_4_ = auVar100._12_4_;
                    auVar162._12_4_ = auVar100._12_4_;
                    auVar137 = auVar157 & auVar148 | auVar162;
                    auVar137 = packssdw(auVar137,auVar137);
                    auVar137 = packssdw(auVar137 ^ auVar134,auVar137 ^ auVar134);
                    auVar137 = packsswb(auVar137,auVar137);
                    if ((auVar137 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                      puVar36[-0x28] = 0xff;
                    }
                    auVar137 = pshufhw(auVar137,auVar148,0x84);
                    auVar95 = pshufhw(auVar100,auVar157,0x84);
                    auVar139 = pshufhw(auVar137,auVar162,0x84);
                    auVar137 = (auVar139 | auVar95 & auVar137) ^ auVar134;
                    auVar137 = packssdw(auVar137,auVar137);
                    auVar137 = packsswb(auVar137,auVar137);
                    if ((auVar137._10_2_ >> 8 & 1) != 0) {
                      puVar36[-0x2c] = 0xff;
                    }
                    auVar137 = (auVar135 | _DAT_00123000) ^ auVar127;
                    auVar101._0_4_ = -(uint)(iVar22 < auVar137._0_4_);
                    auVar101._4_4_ = -(uint)(iVar25 < auVar137._4_4_);
                    auVar101._8_4_ = -(uint)(iVar40 < auVar137._8_4_);
                    auVar101._12_4_ = -(uint)(iVar27 < auVar137._12_4_);
                    auVar158._4_4_ = auVar101._0_4_;
                    auVar158._0_4_ = auVar101._0_4_;
                    auVar158._8_4_ = auVar101._8_4_;
                    auVar158._12_4_ = auVar101._8_4_;
                    auVar95 = pshuflw(auVar162,auVar158,0xe8);
                    auVar68._0_4_ = -(uint)(auVar137._0_4_ == iVar22);
                    auVar68._4_4_ = -(uint)(auVar137._4_4_ == iVar25);
                    auVar68._8_4_ = -(uint)(auVar137._8_4_ == iVar40);
                    auVar68._12_4_ = -(uint)(auVar137._12_4_ == iVar27);
                    auVar149._4_4_ = auVar68._4_4_;
                    auVar149._0_4_ = auVar68._4_4_;
                    auVar149._8_4_ = auVar68._12_4_;
                    auVar149._12_4_ = auVar68._12_4_;
                    auVar137 = pshuflw(auVar68,auVar149,0xe8);
                    auVar150._4_4_ = auVar101._4_4_;
                    auVar150._0_4_ = auVar101._4_4_;
                    auVar150._8_4_ = auVar101._12_4_;
                    auVar150._12_4_ = auVar101._12_4_;
                    auVar139 = pshuflw(auVar101,auVar150,0xe8);
                    auVar137 = packssdw(auVar137 & auVar95,
                                        (auVar139 | auVar137 & auVar95) ^ auVar134);
                    auVar137 = packsswb(auVar137,auVar137);
                    if ((auVar137 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      puVar36[-0x30] = 0xff;
                    }
                    auVar150 = auVar149 & auVar158 | auVar150;
                    auVar139 = packssdw(auVar150,auVar150);
                    auVar137 = packssdw(auVar137,auVar139 ^ auVar134);
                    auVar137 = packsswb(auVar137,auVar137);
                    if ((auVar137._12_2_ >> 8 & 1) != 0) {
                      puVar36[-0x34] = 0xff;
                    }
                    auVar137 = (auVar135 | _DAT_00122ff0) ^ auVar127;
                    auVar69._0_4_ = -(uint)(iVar22 < auVar137._0_4_);
                    auVar69._4_4_ = -(uint)(iVar25 < auVar137._4_4_);
                    auVar69._8_4_ = -(uint)(iVar40 < auVar137._8_4_);
                    auVar69._12_4_ = -(uint)(iVar27 < auVar137._12_4_);
                    auVar151._4_4_ = auVar69._0_4_;
                    auVar151._0_4_ = auVar69._0_4_;
                    auVar151._8_4_ = auVar69._8_4_;
                    auVar151._12_4_ = auVar69._8_4_;
                    auVar136._4_4_ = -(uint)(auVar137._4_4_ == iVar25);
                    auVar136._12_4_ = -(uint)(auVar137._12_4_ == iVar27);
                    auVar136._0_4_ = auVar136._4_4_;
                    auVar136._8_4_ = auVar136._12_4_;
                    auVar138._4_4_ = auVar69._4_4_;
                    auVar138._0_4_ = auVar69._4_4_;
                    auVar138._8_4_ = auVar69._12_4_;
                    auVar138._12_4_ = auVar69._12_4_;
                    auVar139 = auVar136 & auVar151 | auVar138;
                    auVar137 = packssdw(auVar69,auVar139);
                    auVar137 = packssdw(auVar137 ^ auVar134,auVar137 ^ auVar134);
                    auVar137 = packsswb(auVar137,auVar137);
                    if ((auVar137 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      puVar36[-0x38] = 0xff;
                    }
                    auVar137 = pshufhw(auVar137,auVar151,0x84);
                    in_XMM2 = pshufhw(auVar139,auVar136,0x84);
                    in_XMM2 = in_XMM2 & auVar137;
                    auVar137 = pshufhw(auVar137,auVar138,0x84);
                    auVar137 = (auVar137 | in_XMM2) ^ auVar134;
                    auVar137 = packssdw(auVar137,auVar137);
                    in_XMM1 = packsswb(auVar137,auVar137);
                    if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
                      puVar36[-0x3c] = 0xff;
                    }
                    uVar56 = uVar56 + 0x10;
                    puVar36 = puVar36 + -0x40;
                  } while ((uVar24 + 0x10 & 0x3ffffff0) != uVar56);
                }
                if ((int)local_96bc < 1) {
                  sVar21 = s->img_x;
                }
                else {
                  sVar21 = s->img_x;
                  if (0 < (int)sVar20 >> 1) {
                    uVar35 = sVar21 * 4;
                    uVar56 = 1;
                    if (1 < (int)uVar35) {
                      uVar56 = (ulong)uVar35;
                    }
                    uVar24 = (sVar20 - 1) * sVar21 * 4;
                    uVar57 = 0;
                    uVar51 = 0;
                    do {
                      if (0 < (int)sVar21) {
                        uVar42 = 0;
                        do {
                          uVar34 = *(undefined1 *)((long)pvVar33 + uVar42 + uVar57);
                          *(undefined1 *)((long)pvVar33 + uVar42 + uVar57) =
                               *(undefined1 *)((long)pvVar33 + uVar42 + uVar24);
                          *(undefined1 *)((long)pvVar33 + uVar42 + uVar24) = uVar34;
                          uVar42 = uVar42 + 1;
                        } while (uVar56 != uVar42);
                      }
                      uVar51 = uVar51 + 1;
                      uVar24 = uVar24 + sVar21 * -4;
                      uVar57 = (ulong)((int)uVar57 + uVar35);
                    } while (uVar51 != (uint)((int)sVar20 >> 1));
                  }
                }
                *local_96f0 = sVar21;
                *local_96d0 = s->img_y;
                if (local_96e8 != (int *)0x0) {
                  *local_96e8 = s->img_n;
                  return pvVar33;
                }
                return pvVar33;
              }
              local_96b8 = CONCAT44(local_96b8._4_4_,s->img_x * 2) & 0xffffffff00000002;
LAB_0010fcb2:
              if ((local_9748._0_4_ != 0 && (stbi__uint32)local_9798 != 0) && uVar35 != 0) {
                iVar22 = stbi__high_bit((stbi__uint32)local_9798);
                uVar24 = stbi__bitcount((stbi__uint32)local_9798);
                iVar25 = stbi__high_bit(local_9748._0_4_);
                uVar54 = stbi__bitcount(local_9748._0_4_);
                iVar40 = stbi__high_bit(uVar35);
                uVar43 = stbi__bitcount(uVar35);
                iVar27 = stbi__high_bit(sVar23);
                local_96b0 = (stbi_uc *)CONCAT44(local_96b0._4_4_,iVar27);
                uVar48 = stbi__bitcount(sVar23);
                local_9700 = CONCAT44(local_9700._4_4_,uVar24);
                local_96d8 = (stbi__context *)CONCAT44(local_96d8._4_4_,uVar54);
                local_96e0 = CONCAT44(local_96e0._4_4_,uVar43);
                local_96a0 = (stbi__context *)CONCAT44(local_96a0._4_4_,uVar48);
                if ((uVar48 < 9 && uVar43 < 9) && (uVar54 < 9 && uVar24 < 9)) {
                  iVar22 = iVar22 + -7;
                  iVar25 = iVar25 + -7;
                  iVar40 = iVar40 + -7;
                  local_96b0 = (stbi_uc *)CONCAT44(local_96b0._4_4_,(int)local_96b0 + -7);
                  local_96f8 = (stbi_uc *)
                               CONCAT44(local_96f8._4_4_,
                                        (int)CONCAT71((uint7)(uint3)(uVar48 >> 8),1));
                  local_9698 = (ulong)local_9698._4_4_ << 0x20;
                  goto LAB_0011014f;
                }
              }
              free(pvVar33);
              pcVar31 = "bad masks";
              goto LAB_0010f021;
            }
LAB_0010f05e:
            pcVar31 = "outofmem";
            goto LAB_0010f021;
          }
        }
LAB_0010d81a:
        pcVar31 = "too large";
        goto LAB_0010f021;
      }
      if (sVar21 != 0x28) {
        if (sVar21 != 0x38) goto LAB_0010f01a;
        stbi__get32le(s);
        stbi__get32le(s);
        stbi__get32le(s);
        stbi__get32le(s);
      }
      if ((uVar37 == 0x20) || (uVar37 == 0x10)) {
        if (sVar26 != 0) {
          if (sVar26 == 3) {
            local_96f0 = (stbi__uint32 *)x;
            local_9798._0_4_ = stbi__get32le(s);
            local_9748._0_4_ = stbi__get32le(s);
            uVar35 = stbi__get32le(s);
            if (local_9748._0_4_ == uVar35 && (stbi__uint32)local_9798 == local_9748._0_4_)
            goto LAB_0010f01a;
            iVar22 = -0x1a;
            local_9768._0_4_ = 0xff;
            sVar23 = 0;
            x = (int *)local_96f0;
            goto LAB_0010d116;
          }
          goto LAB_0010f01a;
        }
        if (uVar37 != 0x10) {
          if (uVar37 != 0x20) goto LAB_0010f81a;
          uVar37 = 0x20;
          sVar23 = 0xff000000;
          local_9768._0_4_ = 0;
          uVar35 = 0xff;
          local_9748._0_4_ = 0xff00;
          local_9798._0_4_ = 0xff0000;
          goto LAB_0010f83c;
        }
        uVar35 = 0x1f;
        local_9748._0_4_ = 0x3e0;
        local_9798._0_4_ = 0x7c00;
      }
      else {
LAB_0010f81a:
        local_9798._0_4_ = 0;
        local_9748._0_4_ = 0;
        uVar35 = 0;
      }
      local_9768._0_4_ = 0xff;
      sVar23 = 0;
      goto LAB_0010f83c;
    }
  }
LAB_0010f01a:
  pcVar31 = "bad BMP";
  goto LAB_0010f021;
code_r0x0010c9b4:
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  tc[2] = '\0';
  tc[0] = '\0';
  tc[1] = '\0';
  local_9720 = (undefined1  [16])0x0;
  local_9710 = (stbi__context *)0x0;
  lVar55 = 0;
  local_9728 = (undefined1  [8])s;
  do {
    sVar9 = stbi__get8(s);
    if (sVar9 != (&stbi__check_png_header_png_sig)[lVar55]) {
      pcVar31 = "bad png sig";
      goto LAB_0010d666;
    }
    lVar55 = lVar55 + 1;
  } while (lVar55 != 8);
  bVar1 = true;
  psVar30 = (stbi__context *)0x0;
  bVar10 = 0;
  uVar35 = 0;
  bVar15 = false;
  uVar56 = 0;
  uVar24 = 0;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = local_9748._0_8_;
  local_9748 = auVar127 << 0x40;
  bVar2 = false;
  bVar19 = 0;
  local_96f0 = (stbi__uint32 *)x;
  local_96e8 = comp;
  local_96d0 = (stbi__uint32 *)y;
LAB_0010ca73:
  auVar127 = local_9748;
  sVar20 = stbi__get32be(s);
  uVar57 = (ulong)sVar20;
  sVar21 = stbi__get32be(s);
  uVar54 = (uint)uVar56;
  if (0x49484451 < (int)sVar21) {
    if (sVar21 == 0x74524e53) {
      if (!bVar1) {
        if (psVar30 == (stbi__context *)0x0) {
          if (bVar19 == 0) {
            uVar54 = s->img_n;
            if ((uVar54 & 1) == 0) {
              auVar82._8_8_ = 0;
              auVar82._0_8_ = local_9720._8_8_;
              local_9720 = auVar82 << 0x40;
              pcVar31 = "tRNS with alpha";
              goto LAB_0010d666;
            }
            if (uVar54 * 2 == sVar20) {
              bVar2 = true;
              if ((uint)local_9788 == 0x10) {
                local_9788._0_4_ = 0x10;
                if (0 < (int)uVar54) {
                  uVar57 = 0;
                  do {
                    sVar9 = stbi__get8(s);
                    sVar12 = stbi__get8(s);
                    local_96a6[uVar57] = CONCAT11(sVar9,sVar12);
                    if (1 < uVar57) break;
                    uVar57 = uVar57 + 1;
                  } while ((long)uVar57 < (long)s->img_n);
                }
              }
              else if (0 < (int)uVar54) {
                local_9768._0_8_ = uVar56;
                uVar56 = 0;
                do {
                  stbi__get8(s);
                  sVar9 = stbi__get8(s);
                  tc[uVar56] = ""[(int)(uint)local_9788] * sVar9;
                  psVar30 = (stbi__context *)0x0;
                  if (1 < uVar56) break;
                  uVar56 = uVar56 + 1;
                } while ((long)uVar56 < (long)s->img_n);
                bVar19 = 0;
                goto LAB_0010cec6;
              }
              psVar30 = (stbi__context *)0x0;
              bVar1 = false;
              bVar19 = 0;
              goto LAB_0010cecb;
            }
          }
          else {
            if (uVar54 == 0) {
              auVar64._8_8_ = 0;
              auVar64._0_8_ = local_9720._8_8_;
              local_9720 = auVar64 << 0x40;
              pcVar31 = "tRNS before PLTE";
              goto LAB_0010d666;
            }
            if (sVar20 <= uVar54) {
              bVar19 = 4;
              if (sVar20 == 0) {
                psVar30 = (stbi__context *)0x0;
                bVar1 = false;
                goto LAB_0010cecb;
              }
              local_9768._0_8_ = uVar56;
              uVar56 = 0;
              do {
                sVar9 = stbi__get8(s);
                palette[uVar56 * 4 + 3] = sVar9;
                uVar56 = uVar56 + 1;
              } while (uVar57 != uVar56);
              psVar30 = (stbi__context *)0x0;
LAB_0010cec6:
              bVar1 = false;
              uVar56 = local_9768._0_8_;
              goto LAB_0010cecb;
            }
          }
          auVar132._8_8_ = 0;
          auVar132._0_8_ = local_9720._8_8_;
          local_9720 = auVar132 << 0x40;
          pcVar31 = "bad tRNS len";
          goto LAB_0010d666;
        }
        local_9720._0_8_ = psVar30;
        pcVar31 = "tRNS after IDAT";
        goto LAB_0010d666;
      }
    }
    else {
      if (sVar21 != 0x504c5445) {
        if (sVar21 != 0x49484452) goto LAB_0010ccc1;
        if (bVar1) {
          if (sVar20 == 0xd) {
            sVar20 = stbi__get32be(s);
            s->img_x = sVar20;
            sVar20 = stbi__get32be(s);
            s->img_y = sVar20;
            if ((0x1000000 < sVar20) || (0x1000000 < s->img_x)) goto LAB_0010d789;
            bVar10 = stbi__get8(s);
            if ((0x10 < bVar10) ||
               (local_9788._0_4_ = (uint)bVar10, (0x10116U >> ((uint)local_9788 & 0x1f) & 1) == 0))
            {
              local_9720._0_8_ = psVar30;
              pcVar31 = "1/2/4/8/16-bit only";
              goto LAB_0010d666;
            }
            bVar11 = stbi__get8(s);
            if (bVar11 < 7) {
              uVar35 = (uint)bVar11;
              if (bVar11 == 3) {
                bVar19 = 3;
                if ((uint)local_9788 != 0x10) {
LAB_0010cd7c:
                  sVar9 = stbi__get8(s);
                  if (sVar9 != '\0') {
                    local_9720._0_8_ = psVar30;
                    pcVar31 = "bad comp method";
                    goto LAB_0010d666;
                  }
                  sVar9 = stbi__get8(s);
                  if (sVar9 != '\0') {
                    local_9720._0_8_ = psVar30;
                    pcVar31 = "bad filter method";
                    goto LAB_0010d666;
                  }
                  bVar10 = stbi__get8(s);
                  if (1 < bVar10) {
                    local_9720._0_8_ = psVar30;
                    pcVar31 = "bad interlace method";
                    goto LAB_0010d666;
                  }
                  uVar54 = s->img_x;
                  if ((uVar54 == 0) || (uVar43 = s->img_y, uVar43 == 0)) {
                    local_9720._0_8_ = psVar30;
                    pcVar31 = "0-pixel image";
                    goto LAB_0010d666;
                  }
                  if (bVar19 == 0) {
                    uVar48 = (uint)(3 < bVar11) + (bVar11 & 2) + 1;
                    s->img_n = uVar48;
                    if ((uint)((0x40000000 / (ulong)uVar54) / (ulong)uVar48) < uVar43)
                    goto LAB_0010d789;
                    bVar19 = 0;
                  }
                  else {
                    s->img_n = 1;
                    if ((uint)(0x40000000 / (ulong)uVar54 >> 2) < uVar43) {
LAB_0010d789:
                      local_9720._0_8_ = psVar30;
                      pcVar31 = "too large";
                      goto LAB_0010d666;
                    }
                  }
LAB_0010cec1:
                  local_9768._0_8_ = uVar56;
                  goto LAB_0010cec6;
                }
              }
              else if ((bVar11 & 1) == 0) goto LAB_0010cd7c;
            }
            local_9720._0_8_ = psVar30;
            pcVar31 = "bad ctype";
            goto LAB_0010d666;
          }
          local_9720._0_8_ = psVar30;
          pcVar31 = "bad IHDR len";
        }
        else {
          local_9720._0_8_ = psVar30;
          pcVar31 = "multiple IHDR";
        }
        goto LAB_0010d666;
      }
      if (!bVar1) {
        if ((sVar20 < 0x301) &&
           (uVar54 = (sVar20 & 0xffff) / 3, uVar56 = CONCAT44(0,uVar54), uVar54 * 3 == sVar20)) {
          bVar1 = false;
          if (2 < sVar20) {
            local_9768._0_8_ = uVar56;
            uVar57 = 0;
            do {
              sVar9 = stbi__get8(s);
              palette[uVar57 * 4] = sVar9;
              sVar9 = stbi__get8(s);
              palette[uVar57 * 4 + 1] = sVar9;
              sVar9 = stbi__get8(s);
              palette[uVar57 * 4 + 2] = sVar9;
              palette[uVar57 * 4 + 3] = 0xff;
              uVar57 = uVar57 + 1;
            } while (uVar56 != uVar57);
            goto LAB_0010cec6;
          }
          goto LAB_0010cecb;
        }
        local_9720._0_8_ = psVar30;
        pcVar31 = "invalid PLTE";
        goto LAB_0010d666;
      }
    }
LAB_0010d726:
    local_9720._0_8_ = psVar30;
    pcVar31 = "first not IHDR";
    goto LAB_0010d666;
  }
  if (sVar21 == 0x43674249) {
    bVar15 = true;
LAB_0010ccd7:
    stbi__skip(s,sVar20);
LAB_0010cecb:
    stbi__get32be(s);
    goto LAB_0010ca73;
  }
  uVar43 = local_9748._0_4_;
  if (sVar21 == 0x49444154) {
    if (!bVar1) {
      if ((bVar19 == 0) || (uVar54 != 0)) {
        if (sVar20 < 0x40000001) {
          local_9748._0_4_ = sVar20 + uVar43;
          if ((int)uVar43 <= (int)local_9748._0_4_) {
            psVar29 = psVar30;
            if (uVar24 < (uint)local_9748._0_4_) {
              if (sVar20 < 0x1001) {
                uVar57 = 0x1000;
              }
              if (uVar24 != 0) {
                uVar57 = (ulong)uVar24;
              }
              do {
                sVar41 = uVar57;
                uVar24 = (uint)sVar41;
                uVar57 = (ulong)(uVar24 * 2);
              } while (uVar24 < (uint)local_9748._0_4_);
              psVar29 = (stbi__context *)realloc(psVar30,sVar41);
              if (psVar29 == (stbi__context *)0x0) {
                local_9720._0_8_ = psVar30;
                goto LAB_0010e542;
              }
            }
            psVar30 = psVar29;
            iVar22 = stbi__getn(s,psVar30->buffer_start + ((ulong)uVar43 - 0x38),sVar20);
            if (iVar22 != 0) {
              local_9748._4_4_ = 0;
              local_9748._8_8_ = auVar127._8_8_;
              goto LAB_0010cec1;
            }
            local_9720._0_8_ = psVar30;
            pcVar31 = "outofdata";
            goto LAB_0010d666;
          }
          local_9720._0_8_ = psVar30;
          goto LAB_0010d66f;
        }
        local_9720._0_8_ = psVar30;
        pcVar31 = "IDAT size limit";
      }
      else {
        local_9720._0_8_ = psVar30;
        pcVar31 = "no PLTE";
      }
      goto LAB_0010d666;
    }
    goto LAB_0010d726;
  }
  if (sVar21 == 0x49454e44) {
    local_9720._0_8_ = psVar30;
    local_9708 = (uint)local_9788;
    if (!bVar1) {
      if (psVar30 == (stbi__context *)0x0) {
        pcVar31 = "no IDAT";
        goto LAB_0010d666;
      }
      sVar41 = (size_t)(int)(s->img_n * s->img_y * ((uint)local_9788 * s->img_x + 7 >> 3) + s->img_y
                            );
      psVar32 = (stbi_uc *)malloc(sVar41);
      if (psVar32 == (stbi_uc *)0x0) goto LAB_00110113;
      local_9088._8_8_ = psVar30->buffer_start + (long)(int)uVar43 + -0x38;
      local_9058 = psVar32 + sVar41;
      local_9050[0] = '\x01';
      local_9050[1] = '\0';
      local_9050[2] = '\0';
      local_9050[3] = '\0';
      local_9088._0_8_ = psVar30;
      unique0x10005373 = psVar32;
      local_9060 = psVar32;
      if (bVar15) {
LAB_0010d92f:
        local_9088._16_8_ = (stbi_uc *)0x0;
        local_9088._24_8_ = local_9088._24_8_ & 0xffffffff00000000;
        uVar56 = 0;
        local_9088._16_4_ = 0;
        goto LAB_0010d962;
      }
      uVar37 = 0;
      if ((int)uVar43 < 1) {
        bVar11 = 0;
      }
      else {
        bVar11 = (byte)psVar30->img_x;
        psVar30 = (stbi__context *)((long)&psVar30->img_x + 1);
      }
      local_9088._0_8_ = psVar30;
      if (psVar30 < (ulong)local_9088._8_8_) {
        local_9088._0_8_ = (long)&psVar30->img_x + 1;
        uVar37 = (ushort)(byte)psVar30->img_x;
      }
      pcVar31 = "bad zlib header";
      if (((ulong)local_9088._0_8_ < (ulong)local_9088._8_8_) &&
         ((ushort)(((ushort)bVar11 << 8 | uVar37) * 0x7bdf) < 0x843)) {
        if ((uVar37 & 0x20) == 0) {
          if ((bVar11 & 0xf) == 8) goto LAB_0010d92f;
          pcVar31 = "bad compression";
        }
        else {
          pcVar31 = "no preset dict";
        }
      }
      *(char **)(in_FS_OFFSET + -8) = pcVar31;
      goto switchD_0010d9e6_caseD_3;
    }
    goto LAB_0010d726;
  }
LAB_0010ccc1:
  if (bVar1) goto LAB_0010d726;
  bVar1 = false;
  if ((sVar21 >> 0x1d & 1) != 0) goto LAB_0010ccd7;
  local_9720._0_8_ = psVar30;
  stbi__parse_png_file_invalid_chunk[0] = (char)(sVar21 >> 0x18);
  stbi__parse_png_file_invalid_chunk[1] = (char)(sVar21 >> 0x10);
  stbi__parse_png_file_invalid_chunk[2] = (char)(sVar21 >> 8);
  stbi__parse_png_file_invalid_chunk[3] = (char)sVar21;
  *(char **)(in_FS_OFFSET + -8) = stbi__parse_png_file_invalid_chunk;
  goto LAB_0010d66f;
LAB_0010d962:
  uVar5 = local_9088._8_8_;
  psVar30 = (stbi__context *)local_9088._0_8_;
  iVar22 = local_9088._16_4_;
  iVar25 = local_9088._16_4_;
  if (0 < (int)local_9088._16_4_) {
LAB_0010d9f0:
    uVar57 = uVar56 >> 1;
    uVar24 = (uint)uVar57;
    iVar25 = iVar22 + -1;
    local_9768._0_8_ = uVar56;
    psVar30 = (stbi__context *)local_9088._0_8_;
    if (iVar22 < 3) {
      do {
        uVar24 = (uint)uVar57;
        bVar11 = (byte)iVar25 & 0x1f;
        if (uVar24 >> bVar11 != 0) {
          local_9088._0_8_ = local_9088._8_8_;
          uVar43 = uVar24 >> 2;
          local_9088._24_4_ = uVar43;
          uVar54 = iVar25 - 2;
          local_9088._16_4_ = uVar54;
          switch(uVar24 & 3) {
          case 0:
            goto switchD_0010d9e6_caseD_0;
          case 1:
            goto switchD_0010d9e6_caseD_1;
          case 2:
            goto switchD_0010d9e6_caseD_2;
          }
          goto switchD_0010d9e6_caseD_3;
        }
        uVar54 = 0 >> bVar11;
        psVar29 = psVar30;
        if (psVar30 < (ulong)local_9088._8_8_) {
          psVar29 = (stbi__context *)((long)&psVar30->img_x + 1);
          uVar54 = (uint)(byte)psVar30->img_x;
          local_9088._0_8_ = psVar29;
        }
        uVar24 = uVar24 | uVar54 << ((byte)iVar25 & 0x1f);
        uVar57 = (ulong)uVar24;
        iVar22 = iVar25 + 8;
        bVar1 = iVar25 < 0x11;
        psVar30 = psVar29;
        iVar25 = iVar22;
      } while (bVar1);
    }
    uVar43 = uVar24 >> 2;
    local_9088._24_4_ = uVar43;
    uVar54 = iVar25 - 2;
    local_9088._16_4_ = uVar54;
    switch(uVar24 & 3) {
    case 0:
switchD_0010d9e6_caseD_0:
      if ((uVar54 & 7) != 0) {
        stbi__zreceive((stbi__zbuf *)local_9088,uVar54 & 7);
        uVar54 = local_9088._16_4_;
      }
      psVar30 = (stbi__context *)local_9088._0_8_;
      if ((int)uVar54 < 1) {
        if (-1 < (int)uVar54) {
          uVar56 = 0;
LAB_0010dbf3:
          do {
            if (psVar30 < (ulong)local_9088._8_8_) {
              local_9088._0_8_ = (long)&psVar30->img_x + 1;
              uVar45 = (uchar)psVar30->img_x;
              psVar30 = (stbi__context *)local_9088._0_8_;
            }
            else {
              uVar45 = '\0';
            }
            *(uchar *)((long)z_codelength.fast + uVar56) = uVar45;
            uVar56 = uVar56 + 1;
          } while (uVar56 != 4);
          goto LAB_0010dc1f;
        }
      }
      else {
        uVar43 = uVar54 - 1 >> 3;
        uVar56 = (ulong)(uVar43 + 1);
        uVar57 = 0xffffffffffffffff;
        uVar24 = local_9088._24_4_;
        do {
          *(char *)((long)z_codelength.fast + uVar57 + 1) = (char)uVar24;
          uVar24 = uVar24 >> 8;
          uVar57 = uVar57 + 1;
        } while (uVar43 != uVar57);
        iVar22 = uVar54 - (uVar54 - 1 & 0xfffffff8);
        local_9088._24_4_ = uVar24;
        local_9088._16_4_ = iVar22 + -8;
        if (iVar22 == 8) {
          if (uVar57 < 3) goto LAB_0010dbf3;
LAB_0010dc1f:
          if ((z_codelength.fast[1] ^ z_codelength.fast[0]) == 0xffff) {
            uVar56 = (ulong)z_codelength.fast[0];
            if ((ulong)local_9088._8_8_ <
                (stbi__context *)((stbi_uc *)(local_9088._0_8_ + 0x38) + (uVar56 - 0x38))) {
              pcVar31 = "read past buffer";
              goto LAB_001100fd;
            }
            if ((stack0xffffffffffff6f98 + uVar56 <= local_9058) ||
               (iVar22 = stbi__zexpand((stbi__zbuf *)local_9088,(char *)stack0xffffffffffff6f98,
                                       (uint)z_codelength.fast[0]), iVar22 != 0)) {
              psVar32 = stack0xffffffffffff6f98;
              uVar5 = local_9088._0_8_;
              memcpy(stack0xffffffffffff6f98,(void *)local_9088._0_8_,uVar56);
              local_9088._0_8_ = (stbi_uc *)(uVar5 + 0x38) + (uVar56 - 0x38);
              register0x00000028 = psVar32 + uVar56;
              goto LAB_0010dcb5;
            }
            break;
          }
        }
      }
      pcVar31 = "zlib corrupt";
LAB_001100fd:
      *(char **)(in_FS_OFFSET + -8) = pcVar31;
      break;
    case 1:
      goto switchD_0010d9e6_caseD_1;
    case 2:
      goto switchD_0010d9e6_caseD_2;
    }
    goto switchD_0010d9e6_caseD_3;
  }
  do {
    iVar22 = iVar25;
    uVar8 = local_9088._20_4_;
    uVar7 = local_9088._28_4_;
    bVar11 = (byte)iVar22 & 0x1f;
    if ((uint)uVar56 >> bVar11 != 0) {
      local_9088._0_8_ = local_9088._8_8_;
      goto LAB_0010d9f0;
    }
    uVar24 = 0 >> bVar11;
    psVar29 = psVar30;
    if (psVar30 < (ulong)local_9088._8_8_) {
      psVar29 = (stbi__context *)((long)&psVar30->img_x + 1);
      uVar24 = (uint)(byte)psVar30->img_x;
      local_9088._0_8_ = psVar29;
    }
    uVar24 = (uint)uVar56 | uVar24 << ((byte)iVar22 & 0x1f);
    uVar56 = CONCAT44(0,uVar24);
    local_9088._24_8_ = local_9088._24_8_ & 0xffffffff00000000;
    local_9088._16_8_ = local_9088._16_8_ & 0xffffffff00000000;
    psVar30 = psVar29;
    iVar25 = iVar22 + 8;
  } while (iVar22 < 0x11);
  local_9768._0_8_ = uVar56;
  iVar25 = iVar22 + 7;
  uVar43 = uVar24 >> 3;
  local_9088._24_4_ = uVar43;
  local_9088._24_8_ = CONCAT44(uVar7,local_9088._24_4_);
  uVar54 = iVar22 + 5;
  local_9088._16_4_ = uVar54;
  local_9088._16_8_ = CONCAT44(uVar8,local_9088._16_4_);
  switch(uVar24 >> 1 & 3) {
  case 0:
    goto switchD_0010d9e6_caseD_0;
  case 1:
switchD_0010d9e6_caseD_1:
    iVar22 = stbi__zbuild_huffman
                       (&local_904c,
                        "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\b\b\b\b\b\b\b\b"
                        ,0x120);
    if (iVar22 == 0) goto switchD_0010d9e6_caseD_3;
    iVar22 = stbi__zbuild_huffman
                       (local_8868,
                        "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05"
                        ,0x20);
    psVar32 = stack0xffffffffffff6f98;
joined_r0x0010e17b:
    unique0x10005202 = psVar32;
    if (iVar22 == 0) goto switchD_0010d9e6_caseD_3;
    pcVar31 = "bad huffman code";
    while( true ) {
      while (uVar24 = stbi__zhuffman_decode((stbi__zbuf *)local_9088,&local_904c),
            (int)uVar24 < 0x100) {
        if ((int)uVar24 < 0) goto LAB_001100fd;
        if ((local_9058 <= psVar32) &&
           (iVar22 = stbi__zexpand((stbi__zbuf *)local_9088,(char *)psVar32,1),
           psVar32 = stack0xffffffffffff6f98, iVar22 == 0)) goto switchD_0010d9e6_caseD_3;
        *psVar32 = (stbi_uc)uVar24;
        psVar32 = psVar32 + 1;
      }
      if (uVar24 == 0x100) break;
      if (0x11d < uVar24) goto LAB_001100fd;
      uVar56 = (ulong)(uVar24 - 0x101);
      uVar24 = stbi__zlength_base[uVar56];
      if (0xffffffffffffffeb < uVar56 - 0x1c) {
        uVar54 = stbi__zreceive((stbi__zbuf *)local_9088,stbi__zlength_extra[uVar56]);
        uVar24 = uVar24 + uVar54;
      }
      uVar54 = stbi__zhuffman_decode((stbi__zbuf *)local_9088,local_8868);
      if (0x1d < uVar54) goto LAB_001100fd;
      iVar22 = stbi__zdist_base[uVar54];
      if (3 < uVar54) {
        uVar54 = stbi__zreceive((stbi__zbuf *)local_9088,stbi__zdist_extra[uVar54]);
        iVar22 = iVar22 + uVar54;
      }
      if ((long)psVar32 - (long)local_9060 < (long)iVar22) {
        pcVar31 = "bad dist";
        goto LAB_001100fd;
      }
      if (((long)local_9058 - (long)psVar32 < (long)(int)uVar24) &&
         (iVar25 = stbi__zexpand((stbi__zbuf *)local_9088,(char *)psVar32,uVar24),
         psVar32 = stack0xffffffffffff6f98, iVar25 == 0)) goto switchD_0010d9e6_caseD_3;
      lVar55 = -(long)iVar22;
      if (iVar22 == 1) {
        if (uVar24 != 0) {
          memset(psVar32,(uint)psVar32[lVar55],(ulong)uVar24);
          psVar32 = psVar32 + (ulong)(uVar24 - 1) + 1;
        }
      }
      else {
        for (; uVar24 != 0; uVar24 = uVar24 - 1) {
          *psVar32 = psVar32[lVar55];
          psVar32 = psVar32 + 1;
        }
      }
    }
    unique0x1000523a = psVar32;
    if ((local_9088._20_4_ != 0) && ((int)local_9088._16_4_ < 0x10)) {
      pcVar31 = "unexpected end";
      goto LAB_001100fd;
    }
LAB_0010dcb5:
    if ((local_9768 & (undefined1  [16])0x1) != (undefined1  [16])0x0) goto LAB_0010fd94;
    uVar56 = local_9088._24_8_ & 0xffffffff;
    goto LAB_0010d962;
  case 3:
    goto switchD_0010d9e6_caseD_3;
  }
switchD_0010d9e6_caseD_2:
  psVar29 = (stbi__context *)local_9088._0_8_;
  psVar30 = (stbi__context *)local_9088._0_8_;
  uVar7 = local_9088._28_4_;
  uVar8 = local_9088._20_4_;
  uVar24 = uVar54;
  if (iVar25 < 7) {
    do {
      uVar8 = local_9088._20_4_;
      uVar7 = local_9088._28_4_;
      bVar11 = (byte)uVar24 & 0x1f;
      if (uVar43 >> bVar11 != 0) {
        local_9088._0_8_ = local_9088._8_8_;
        psVar30 = (stbi__context *)local_9088._8_8_;
        uVar54 = uVar24;
        break;
      }
      uVar54 = 0 >> bVar11;
      psVar30 = psVar29;
      if (psVar29 < (ulong)local_9088._8_8_) {
        psVar30 = (stbi__context *)((long)&psVar29->img_x + 1);
        uVar54 = (uint)(byte)psVar29->img_x;
        local_9088._0_8_ = psVar30;
      }
      uVar43 = uVar43 | uVar54 << ((byte)uVar24 & 0x1f);
      local_9088._24_8_ = local_9088._24_8_ & 0xffffffff00000000;
      uVar54 = uVar24 + 8;
      local_9088._16_8_ = local_9088._16_8_ & 0xffffffff00000000;
      bVar1 = (int)uVar24 < 0x11;
      psVar29 = psVar30;
      uVar24 = uVar54;
    } while (bVar1);
  }
  local_9088._20_4_ = uVar8;
  local_9088._28_4_ = uVar7;
  uVar24 = uVar43 >> 5;
  psVar29 = psVar30;
  iVar25 = uVar54 - 5;
  iVar22 = uVar54 - 5;
  if ((int)uVar54 < 10) {
    do {
      bVar11 = (byte)iVar22 & 0x1f;
      if (uVar24 >> bVar11 != 0) {
        local_9088._0_8_ = local_9088._8_8_;
        psVar29 = (stbi__context *)local_9088._8_8_;
        iVar25 = iVar22;
        break;
      }
      uVar54 = 0 >> bVar11;
      psVar29 = psVar30;
      if (psVar30 < (ulong)local_9088._8_8_) {
        psVar29 = (stbi__context *)((long)&psVar30->img_x + 1);
        uVar54 = (uint)(byte)psVar30->img_x;
        local_9088._0_8_ = psVar29;
      }
      uVar24 = uVar24 | uVar54 << ((byte)iVar22 & 0x1f);
      iVar25 = iVar22 + 8;
      bVar1 = iVar22 < 0x11;
      psVar30 = psVar29;
      iVar22 = iVar25;
    } while (bVar1);
  }
  uVar54 = uVar24 >> 5;
  psVar30 = psVar29;
  iVar40 = iVar25 + -5;
  iVar22 = iVar25 + -5;
  if (iVar25 < 9) {
    do {
      bVar11 = (byte)iVar22 & 0x1f;
      if (uVar54 >> bVar11 != 0) {
        local_9088._0_8_ = local_9088._8_8_;
        psVar30 = (stbi__context *)local_9088._8_8_;
        iVar40 = iVar22;
        break;
      }
      uVar48 = 0 >> bVar11;
      psVar30 = psVar29;
      if (psVar29 < (ulong)local_9088._8_8_) {
        psVar30 = (stbi__context *)((long)&psVar29->img_x + 1);
        uVar48 = (uint)(byte)psVar29->img_x;
        local_9088._0_8_ = psVar30;
      }
      uVar54 = uVar54 | uVar48 << ((byte)iVar22 & 0x1f);
      iVar40 = iVar22 + 8;
      bVar1 = iVar22 < 0x11;
      psVar29 = psVar30;
      iVar22 = iVar40;
    } while (bVar1);
  }
  uVar43 = (uVar43 & 0x1f) + 0x101;
  iVar22 = (uVar24 & 0x1f) + 1;
  uVar24 = uVar54 >> 4;
  local_9088._24_8_ = (ulong)(uint)local_9088._28_4_ << 0x20;
  iVar40 = iVar40 + -4;
  local_9088._16_8_ = (ulong)(uint)local_9088._20_4_ << 0x20;
  local_9678 = SUB1615((undefined1  [16])0x0,0);
  uStack_9669 = 0;
  uVar56 = 0;
  do {
    psVar29 = psVar30;
    uVar48 = uVar24;
    iVar25 = iVar40;
    uVar7 = local_9088._28_4_;
    uVar8 = local_9088._20_4_;
    if (iVar40 < 3) {
      do {
        uVar8 = local_9088._20_4_;
        uVar7 = local_9088._28_4_;
        bVar11 = (byte)iVar40 & 0x1f;
        if (uVar24 >> bVar11 != 0) {
          local_9088._0_8_ = uVar5;
          psVar30 = (stbi__context *)uVar5;
          uVar48 = uVar24;
          iVar25 = iVar40;
          break;
        }
        uVar48 = 0 >> bVar11;
        if (psVar29 < (ulong)uVar5) {
          psVar30 = (stbi__context *)((long)&psVar29->img_x + 1);
          uVar48 = (uint)(byte)psVar29->img_x;
          psVar29 = psVar30;
          local_9088._0_8_ = psVar30;
        }
        uVar24 = uVar24 | uVar48 << ((byte)iVar40 & 0x1f);
        local_9088._24_8_ = local_9088._24_8_ & 0xffffffff00000000;
        iVar25 = iVar40 + 8;
        local_9088._16_8_ = local_9088._16_8_ & 0xffffffff00000000;
        bVar1 = iVar40 < 0x11;
        uVar48 = uVar24;
        iVar40 = iVar25;
      } while (bVar1);
    }
    local_9088._20_4_ = uVar8;
    local_9088._28_4_ = uVar7;
    uVar24 = uVar48 >> 3;
    local_9088._24_4_ = uVar24;
    iVar40 = iVar25 + -3;
    local_9088._16_4_ = iVar40;
    local_9678[(byte)(&stbi__compute_huffman_codes_length_dezigzag)[uVar56]] = (byte)uVar48 & 7;
    uVar56 = uVar56 + 1;
  } while (uVar56 != (uVar54 & 0xf) + 4);
  iVar25 = stbi__zbuild_huffman(&z_codelength,local_9678,0x13);
  if (iVar25 == 0) goto switchD_0010d9e6_caseD_3;
  iVar25 = iVar22 + uVar43;
  iVar40 = 0;
  do {
    uVar24 = stbi__zhuffman_decode((stbi__zbuf *)local_9088,&z_codelength);
    if (0x12 < uVar24) goto LAB_0010f067;
    if (uVar24 < 0x10) {
      lVar55 = (long)iVar40;
      iVar40 = iVar40 + 1;
      lencodes[lVar55] = (stbi_uc)uVar24;
    }
    else {
      if (uVar24 == 0x11) {
        psVar30 = (stbi__context *)local_9088._0_8_;
        iVar27 = local_9088._16_4_;
        uVar24 = local_9088._24_4_;
        uVar5 = local_9088._16_8_;
        uVar6 = local_9088._24_8_;
        if ((int)local_9088._16_4_ < 3) {
          do {
            local_9088._24_8_ = uVar6;
            local_9088._16_8_ = uVar5;
            uVar5 = local_9088._24_8_;
            uVar4 = local_9088._16_8_;
            bVar11 = (byte)iVar27 & 0x1f;
            if (uVar24 >> bVar11 != 0) {
              local_9088._0_8_ = local_9088._8_8_;
              goto LAB_0010e0a9;
            }
            uVar54 = 0 >> bVar11;
            psVar29 = psVar30;
            if (psVar30 < (ulong)local_9088._8_8_) {
              psVar29 = (stbi__context *)((long)&psVar30->img_x + 1);
              uVar54 = (uint)(byte)psVar30->img_x;
              local_9088._0_8_ = psVar29;
            }
            uVar24 = uVar24 | uVar54 << ((byte)iVar27 & 0x1f);
            local_9088._24_8_ = local_9088._24_8_ & 0xffffffff00000000;
            uVar6 = local_9088._24_8_;
            local_9088._28_4_ = SUB84(uVar5,4);
            iVar159 = iVar27 + 8;
            local_9088._16_8_ = local_9088._16_8_ & 0xffffffff00000000;
            uVar5 = local_9088._16_8_;
            local_9088._20_4_ = SUB84(uVar4,4);
            bVar1 = iVar27 < 0x11;
            psVar30 = psVar29;
            iVar27 = iVar159;
          } while (bVar1);
        }
        else {
LAB_0010e0a9:
          iVar159 = iVar27;
        }
        local_9088._24_4_ = uVar24 >> 3;
        local_9088._16_4_ = iVar159 + -3;
        uVar24 = (uVar24 & 7) + 3;
LAB_0010e0fb:
        bVar11 = 0;
      }
      else {
        if (uVar24 != 0x10) {
          psVar30 = (stbi__context *)local_9088._0_8_;
          iVar27 = local_9088._16_4_;
          uVar24 = local_9088._24_4_;
          uVar5 = local_9088._16_8_;
          uVar6 = local_9088._24_8_;
          if ((int)local_9088._16_4_ < 7) {
            do {
              local_9088._24_8_ = uVar6;
              local_9088._16_8_ = uVar5;
              uVar5 = local_9088._24_8_;
              uVar4 = local_9088._16_8_;
              bVar11 = (byte)iVar27 & 0x1f;
              if (uVar24 >> bVar11 != 0) {
                local_9088._0_8_ = local_9088._8_8_;
                goto LAB_0010e0d7;
              }
              uVar54 = 0 >> bVar11;
              psVar29 = psVar30;
              if (psVar30 < (ulong)local_9088._8_8_) {
                psVar29 = (stbi__context *)((long)&psVar30->img_x + 1);
                uVar54 = (uint)(byte)psVar30->img_x;
                local_9088._0_8_ = psVar29;
              }
              uVar24 = uVar24 | uVar54 << ((byte)iVar27 & 0x1f);
              local_9088._24_8_ = local_9088._24_8_ & 0xffffffff00000000;
              uVar6 = local_9088._24_8_;
              local_9088._28_4_ = SUB84(uVar5,4);
              iVar159 = iVar27 + 8;
              local_9088._16_8_ = local_9088._16_8_ & 0xffffffff00000000;
              uVar5 = local_9088._16_8_;
              local_9088._20_4_ = SUB84(uVar4,4);
              bVar1 = iVar27 < 0x11;
              psVar30 = psVar29;
              iVar27 = iVar159;
            } while (bVar1);
          }
          else {
LAB_0010e0d7:
            iVar159 = iVar27;
          }
          local_9088._24_4_ = uVar24 >> 7;
          local_9088._16_4_ = iVar159 + -7;
          uVar24 = (uVar24 & 0x7f) + 0xb;
          goto LAB_0010e0fb;
        }
        psVar30 = (stbi__context *)local_9088._0_8_;
        iVar27 = local_9088._16_4_;
        uVar24 = local_9088._24_4_;
        uVar5 = local_9088._16_8_;
        uVar6 = local_9088._24_8_;
        if ((int)local_9088._16_4_ < 2) {
          do {
            local_9088._24_8_ = uVar6;
            local_9088._16_8_ = uVar5;
            uVar5 = local_9088._24_8_;
            uVar4 = local_9088._16_8_;
            bVar11 = (byte)iVar27 & 0x1f;
            if (uVar24 >> bVar11 != 0) {
              local_9088._0_8_ = local_9088._8_8_;
              goto LAB_0010e066;
            }
            uVar54 = 0 >> bVar11;
            psVar29 = psVar30;
            if (psVar30 < (ulong)local_9088._8_8_) {
              psVar29 = (stbi__context *)((long)&psVar30->img_x + 1);
              local_9088._0_8_ = psVar29;
              uVar54 = (uint)(byte)psVar30->img_x;
            }
            uVar24 = uVar24 | uVar54 << ((byte)iVar27 & 0x1f);
            local_9088._24_8_ = local_9088._24_8_ & 0xffffffff00000000;
            uVar6 = local_9088._24_8_;
            local_9088._28_4_ = SUB84(uVar5,4);
            iVar159 = iVar27 + 8;
            local_9088._16_8_ = local_9088._16_8_ & 0xffffffff00000000;
            uVar5 = local_9088._16_8_;
            local_9088._20_4_ = SUB84(uVar4,4);
            bVar1 = iVar27 < 0x11;
            psVar30 = psVar29;
            iVar27 = iVar159;
          } while (bVar1);
        }
        else {
LAB_0010e066:
          iVar159 = iVar27;
        }
        local_9088._24_4_ = uVar24 >> 2;
        local_9088._16_4_ = iVar159 + -2;
        if (iVar40 == 0) goto LAB_0010f067;
        uVar24 = (uVar24 & 3) + 3;
        bVar11 = lencodes[(long)iVar40 + -1];
      }
      if (iVar25 - iVar40 < (int)uVar24) goto LAB_0010f067;
      memset(lencodes + iVar40,(uint)bVar11,(ulong)uVar24);
      iVar40 = iVar40 + uVar24;
    }
  } while (iVar40 < iVar25);
  if (iVar40 == iVar25) {
    iVar25 = stbi__zbuild_huffman(&local_904c,lencodes,uVar43);
    if (iVar25 == 0) goto switchD_0010d9e6_caseD_3;
    iVar22 = stbi__zbuild_huffman(local_8868,lencodes + uVar43,iVar22);
    psVar32 = stack0xffffffffffff6f98;
    goto joined_r0x0010e17b;
  }
LAB_0010f067:
  *(char **)(in_FS_OFFSET + -8) = "bad codelengths";
switchD_0010d9e6_caseD_3:
  free(local_9060);
LAB_00110113:
  local_9720._8_8_ = 0;
LAB_0010d66f:
  psVar30 = (stbi__context *)0x0;
  psVar32 = (stbi_uc *)local_9720._8_8_;
LAB_0010d67a:
  free(local_9710);
  free(psVar32);
  psVar32 = (stbi_uc *)local_9720._0_8_;
  goto LAB_0010d697;
LAB_0010fd94:
  local_96c8 = local_9060;
  local_9720._8_8_ = local_9060;
  psVar32 = local_96c8;
  local_96f8 = stack0xffffffffffff6f98;
  if (local_9060 == (stbi_uc *)0x0) goto LAB_0010d66f;
  local_96c8._0_4_ = (int)local_9060;
  local_96f8 = (stbi_uc *)(ulong)(uint)((int)stack0xffffffffffff6f98 - (int)local_96c8);
  local_96c8 = psVar32;
  free((void *)local_9720._0_8_);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = local_9720._8_8_;
  local_9720 = auVar84 << 0x40;
  iVar22 = s->img_n + 1;
  iVar25 = s->img_n;
  if (bVar2) {
    iVar25 = iVar22;
  }
  local_968c = iVar25;
  if (bVar19 == 0) {
    local_968c = iVar22;
  }
  if (iVar22 != 4) {
    local_968c = iVar25;
  }
  s->img_out_n = local_968c;
  local_9680 = (ulong)local_9708;
  local_96c0 = local_968c << (local_9708 == 0x10);
  uVar24 = *(stbi__uint32 *)local_9728;
  uVar56 = (ulong)uVar24;
  if (bVar10 == 0) {
    iVar22 = stbi__create_png_image_raw
                       ((stbi__png *)local_9728,local_96c8,(stbi__uint32)local_96f8,local_968c,
                        uVar24,*(stbi__uint32 *)((long)local_9728 + 4),local_9708,uVar35);
    if (iVar22 != 0) goto LAB_00110b84;
    goto LAB_0010d66f;
  }
  local_9688 = (stbi__context *)
               stbi__malloc_mad3(uVar24,*(stbi__uint32 *)((long)local_9728 + 4),local_96c0,0);
  if (local_9688 == (stbi__context *)0x0) {
LAB_0010e542:
    pcVar31 = "outofmem";
LAB_0010d666:
    *(char **)(in_FS_OFFSET + -8) = pcVar31;
    goto LAB_0010d66f;
  }
  local_96e0 = (ulong)local_96c0;
  lVar55 = 0;
  do {
    uVar24 = (&DAT_00123660)[lVar55];
    uVar54 = (&DAT_001236a0)[lVar55];
    uVar46 = ~uVar24 + *(stbi__uint32 *)local_9728 + uVar54;
    uVar44 = uVar46 / uVar54;
    uVar43 = (&DAT_00123680)[lVar55];
    uVar48 = (&DAT_001236c0)[lVar55];
    uVar39 = ~uVar43 + *(stbi__uint32 *)((long)local_9728 + 4) + uVar48;
    uVar47 = uVar39 / uVar48;
    local_96b8 = lVar55;
    if (uVar54 <= uVar46) {
      local_9700 = CONCAT44(local_9700._4_4_,uVar48);
      if (uVar48 <= uVar39) {
        local_96bc = uVar44 * (int)local_9680 * *(int *)((long)local_9728 + 8);
        iVar22 = stbi__create_png_image_raw
                           ((stbi__png *)local_9728,local_96c8,(stbi__uint32)local_96f8,local_968c,
                            uVar44,uVar47,(int)local_9680,uVar35);
        if (iVar22 == 0) {
          free(local_9688);
          goto LAB_0010d66f;
        }
        local_96d8 = local_9710;
        if (0 < (int)uVar47) {
          local_9698 = (ulong)uVar47;
          local_96a0 = (stbi__context *)local_9728;
          local_96b0 = local_9688->buffer_start + (long)(int)uVar24 * local_96e0 + -0x38;
          iVar22 = uVar43 * local_96c0;
          local_9700 = CONCAT44(local_9700._4_4_,(uint)local_9700 * local_96c0);
          lVar55 = (long)(int)uVar54 * local_96e0;
          auVar85._8_8_ = 0;
          auVar85._0_8_ = local_9748._8_8_;
          local_9748 = auVar85 << 0x40;
          do {
            psVar30 = local_96d8;
            uVar56 = local_96e0;
            if (0 < (int)uVar44) {
              psVar32 = local_96b0 + local_96a0->img_x * iVar22;
              lVar53 = 0;
              do {
                memcpy(psVar32,psVar30->buffer_start +
                               (local_9748._0_8_ * (long)(int)uVar44 + lVar53) * uVar56 + -0x38,
                       uVar56);
                lVar53 = lVar53 + 1;
                psVar32 = psVar32 + lVar55;
              } while (lVar53 < (int)uVar44);
            }
            uVar56 = local_9748._0_8_ + 1;
            iVar22 = iVar22 + (uint)local_9700;
            local_9748._0_8_ = uVar56;
          } while (uVar56 < local_9698);
        }
        uVar47 = (((int)(local_96bc + 7) >> 3) + 1) * uVar47;
        free(local_96d8);
        local_96c8 = local_96c8 + uVar47;
        local_96f8 = (stbi_uc *)(ulong)((int)local_96f8 - uVar47);
      }
    }
    lVar55 = local_96b8 + 1;
  } while (lVar55 != 7);
  local_9710 = local_9688;
  uVar56 = 7;
LAB_00110b84:
  psVar30 = local_9710;
  uVar35 = (uint)uVar56;
  if (bVar2) {
    iVar25 = *(stbi__uint32 *)((long)local_9728 + 4) * *(stbi__uint32 *)local_9728;
    iVar22 = s->img_out_n;
    if (local_9708 == 0x10) {
      if (iVar22 == 2) {
        if (iVar25 != 0) {
          lVar55 = 0;
          do {
            *(ushort *)(local_9710->buffer_start + lVar55 * 4 + -0x36) =
                 -(ushort)(*(short *)(local_9710->buffer_start + lVar55 * 4 + -0x38) !=
                          local_96a6[0]);
            lVar55 = lVar55 + 1;
          } while (iVar25 != (int)lVar55);
        }
      }
      else {
        if (iVar22 != 4) {
          __assert_fail("out_n == 2 || out_n == 4",
                        "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-stb-image.h"
                        ,0x134b,"int stbi__compute_transparency16(stbi__png *, stbi__uint16 *, int)"
                       );
        }
        if (iVar25 != 0) {
          uVar56 = 0;
          do {
            if (((*(short *)(local_9710->buffer_start + uVar56 * 8 + -0x38) == local_96a6[0]) &&
                (*(short *)(local_9710->buffer_start + uVar56 * 8 + -0x36) == local_96a6[1])) &&
               (*(short *)(local_9710->buffer_start + uVar56 * 8 + -0x34) == local_96a6[2])) {
              (local_9710->buffer_start + uVar56 * 8 + -0x32)[0] = '\0';
              (local_9710->buffer_start + uVar56 * 8 + -0x32)[1] = '\0';
            }
            uVar56 = uVar56 + 1;
          } while (iVar25 != (int)uVar56);
        }
      }
    }
    else if (iVar22 == 2) {
      if (iVar25 != 0) {
        lVar55 = 0;
        do {
          local_9710->buffer_start[lVar55 * 2 + -0x37] =
               -(local_9710->buffer_start[lVar55 * 2 + -0x38] != tc[0]);
          lVar55 = lVar55 + 1;
        } while (iVar25 != (int)lVar55);
      }
    }
    else {
      if (iVar22 != 4) {
        __assert_fail("out_n == 2 || out_n == 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-stb-image.h"
                      ,0x1332,"int stbi__compute_transparency(stbi__png *, stbi_uc *, int)");
      }
      if (iVar25 != 0) {
        uVar56 = 0;
        do {
          if (((local_9710->buffer_start[uVar56 * 4 + -0x38] == tc[0]) &&
              (local_9710->buffer_start[uVar56 * 4 + -0x37] == tc[1])) &&
             (local_9710->buffer_start[uVar56 * 4 + -0x36] == tc[2])) {
            local_9710->buffer_start[uVar56 * 4 + -0x35] = '\0';
          }
          uVar56 = uVar56 + 1;
        } while (iVar25 != (int)uVar56);
      }
    }
    uVar35 = (uint)uVar56;
    if (bVar19 == 0) {
      s->img_n = s->img_n + 1;
    }
    else {
LAB_00110f4b:
      s->img_n = (uint)bVar19;
      s->img_out_n = 4;
      uVar24 = *(stbi__uint32 *)((long)local_9728 + 4) * *(stbi__uint32 *)local_9728;
      if ((0x1fffffff < uVar24) ||
         (psVar29 = (stbi__context *)malloc((ulong)(uVar24 * 4)), psVar29 == (stbi__context *)0x0))
      goto LAB_0010e542;
      if (uVar24 != 0) {
        uVar56 = 0;
        do {
          *(undefined4 *)(psVar29->buffer_start + uVar56 * 4 + -0x38) =
               *(undefined4 *)(palette + (ulong)psVar30->buffer_start[uVar56 - 0x38] * 4);
          uVar56 = uVar56 + 1;
        } while (uVar24 != uVar56);
      }
      free(psVar30);
      local_9710 = psVar29;
    }
  }
  else if (bVar19 != 0) goto LAB_00110f4b;
  free((void *)local_9720._8_8_);
  stbi__get32be(s);
  psVar30 = local_9710;
  auVar3 = local_9728;
  if ((int)local_9708 < 9) {
    *piVar49 = 8;
    local_9710 = (stbi__context *)0x0;
    if (*(int *)((long)local_9728 + 0xc) != 4) {
      psVar30 = (stbi__context *)
                stbi__convert_format
                          ((uchar *)psVar30,*(int *)((long)local_9728 + 0xc),
                           *(stbi__uint32 *)local_9728,*(stbi__uint32 *)((long)local_9728 + 4),
                           uVar35);
LAB_0011106e:
      *(int *)((long)auVar3 + 0xc) = 4;
      if (psVar30 == (stbi__context *)0x0) {
        return (void *)0x0;
      }
    }
  }
  else {
    if (local_9708 != 0x10) {
      pcVar31 = "bad bits_per_channel";
LAB_0010f021:
      *(char **)(in_FS_OFFSET + -8) = pcVar31;
      return (void *)0x0;
    }
    *piVar49 = 0x10;
    local_9710 = (stbi__context *)0x0;
    if (*(int *)((long)local_9728 + 0xc) != 4) {
      psVar30 = (stbi__context *)
                stbi__convert_format16
                          ((stbi__uint16 *)psVar30,*(int *)((long)local_9728 + 0xc),
                           *(stbi__uint32 *)local_9728,*(stbi__uint32 *)((long)local_9728 + 4),
                           uVar35);
      goto LAB_0011106e;
    }
  }
  *local_96f0 = *(stbi__uint32 *)auVar3;
  *local_96d0 = *(stbi__uint32 *)((long)auVar3 + 4);
  if (local_96e8 != (int *)0x0) {
    *local_96e8 = *(int *)((long)auVar3 + 8);
  }
  psVar32 = (stbi_uc *)0x0;
  goto LAB_0010d67a;
LAB_001111b5:
  pcVar31 = "illegal code in raster";
LAB_0010f929:
  *(char **)(in_FS_OFFSET + -8) = pcVar31;
  goto LAB_0010f932;
LAB_0010e74b:
  if (uVar57 < uVar35) {
    iVar22 = stbi__psd_decode_rle(s,(stbi_uc *)((long)pvVar33 + uVar57),uVar24);
    auVar127 = _DAT_00122ff0;
    auVar64 = _DAT_00123000;
    auVar82 = _DAT_00123010;
    auVar132 = _DAT_00123020;
    auVar84 = _DAT_00123030;
    auVar85 = _DAT_00123040;
    auVar60 = _DAT_00123050;
    auVar137 = _DAT_00123060;
    if (iVar22 == 0) {
      free(pvVar33);
      pcVar31 = "corrupt";
      goto LAB_0010f021;
    }
  }
  else if (0 < (int)uVar24) {
    cVar14 = -(uVar57 == 3);
    uVar51 = 0;
    do {
      auVar58._8_4_ = (int)uVar51;
      auVar58._0_8_ = uVar51;
      auVar58._12_4_ = (int)(uVar51 >> 0x20);
      auVar139 = auVar133 ^ _DAT_00122280;
      auVar95 = (auVar58 | auVar137) ^ _DAT_00122280;
      iVar22 = auVar139._0_4_;
      iVar159 = -(uint)(iVar22 < auVar95._0_4_);
      iVar25 = auVar139._4_4_;
      auVar71._4_4_ = -(uint)(iVar25 < auVar95._4_4_);
      iVar40 = auVar139._8_4_;
      iVar163 = -(uint)(iVar40 < auVar95._8_4_);
      iVar27 = auVar139._12_4_;
      auVar71._12_4_ = -(uint)(iVar27 < auVar95._12_4_);
      auVar103._4_4_ = iVar159;
      auVar103._0_4_ = iVar159;
      auVar103._8_4_ = iVar163;
      auVar103._12_4_ = iVar163;
      auVar139 = pshuflw(in_XMM5,auVar103,0xe8);
      auVar70._4_4_ = -(uint)(auVar95._4_4_ == iVar25);
      auVar70._12_4_ = -(uint)(auVar95._12_4_ == iVar27);
      auVar70._0_4_ = auVar70._4_4_;
      auVar70._8_4_ = auVar70._12_4_;
      auVar128 = pshuflw(in_XMM6,auVar70,0xe8);
      auVar71._0_4_ = auVar71._4_4_;
      auVar71._8_4_ = auVar71._12_4_;
      auVar95 = pshuflw(auVar139,auVar71,0xe8);
      auVar129._8_4_ = 0xffffffff;
      auVar129._0_8_ = 0xffffffffffffffff;
      auVar129._12_4_ = 0xffffffff;
      auVar139 = (auVar95 | auVar128 & auVar139) ^ auVar129;
      auVar139 = packssdw(auVar139,auVar139);
      if ((auVar139 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(char *)(lVar55 + uVar51 * 4 + -0x3c) = cVar14;
      }
      auVar71 = auVar70 & auVar103 | auVar71;
      auVar139 = packssdw(auVar71,auVar71);
      auVar139 = packssdw(auVar139 ^ auVar129,auVar139 ^ auVar129);
      auVar139 = packsswb(auVar139,auVar139);
      if ((auVar139._0_4_ >> 8 & 1) != 0) {
        *(char *)(lVar55 + uVar51 * 4 + -0x38) = cVar14;
      }
      auVar139 = (auVar58 | auVar60) ^ _DAT_00122280;
      iVar159 = -(uint)(iVar22 < auVar139._0_4_);
      auVar120._4_4_ = -(uint)(iVar25 < auVar139._4_4_);
      iVar163 = -(uint)(iVar40 < auVar139._8_4_);
      auVar120._12_4_ = -(uint)(iVar27 < auVar139._12_4_);
      auVar72._4_4_ = iVar159;
      auVar72._0_4_ = iVar159;
      auVar72._8_4_ = iVar163;
      auVar72._12_4_ = iVar163;
      auVar104._4_4_ = -(uint)(auVar139._4_4_ == iVar25);
      auVar104._12_4_ = -(uint)(auVar139._12_4_ == iVar27);
      auVar104._0_4_ = auVar104._4_4_;
      auVar104._8_4_ = auVar104._12_4_;
      auVar120._0_4_ = auVar120._4_4_;
      auVar120._8_4_ = auVar120._12_4_;
      auVar139 = auVar104 & auVar72 | auVar120;
      auVar139 = packssdw(auVar139,auVar139);
      auVar139 = packssdw(auVar139 ^ auVar129,auVar139 ^ auVar129);
      auVar139 = packsswb(auVar139,auVar139);
      if ((auVar139._0_4_ >> 0x10 & 1) != 0) {
        *(char *)(lVar55 + uVar51 * 4 + -0x34) = cVar14;
      }
      auVar95 = pshufhw(auVar72,auVar72,0x84);
      auVar105 = pshufhw(auVar104,auVar104,0x84);
      auVar128 = pshufhw(auVar95,auVar120,0x84);
      auVar95 = (auVar128 | auVar105 & auVar95) ^ auVar129;
      auVar95 = packssdw(auVar95,auVar95);
      auVar95 = packsswb(auVar95,auVar95);
      if ((auVar95._0_4_ >> 0x18 & 1) != 0) {
        *(char *)(lVar55 + uVar51 * 4 + -0x30) = cVar14;
      }
      auVar95 = (auVar58 | auVar85) ^ _DAT_00122280;
      iVar159 = -(uint)(iVar22 < auVar95._0_4_);
      auVar74._4_4_ = -(uint)(iVar25 < auVar95._4_4_);
      iVar163 = -(uint)(iVar40 < auVar95._8_4_);
      auVar74._12_4_ = -(uint)(iVar27 < auVar95._12_4_);
      auVar106._4_4_ = iVar159;
      auVar106._0_4_ = iVar159;
      auVar106._8_4_ = iVar163;
      auVar106._12_4_ = iVar163;
      auVar139 = pshuflw(auVar139,auVar106,0xe8);
      auVar73._4_4_ = -(uint)(auVar95._4_4_ == iVar25);
      auVar73._12_4_ = -(uint)(auVar95._12_4_ == iVar27);
      auVar73._0_4_ = auVar73._4_4_;
      auVar73._8_4_ = auVar73._12_4_;
      auVar128 = pshuflw(auVar129,auVar73,0xe8);
      auVar74._0_4_ = auVar74._4_4_;
      auVar74._8_4_ = auVar74._12_4_;
      auVar95 = pshuflw(auVar139,auVar74,0xe8);
      auVar130._8_4_ = 0xffffffff;
      auVar130._0_8_ = 0xffffffffffffffff;
      auVar130._12_4_ = 0xffffffff;
      auVar139 = (auVar95 | auVar128 & auVar139) ^ auVar130;
      auVar139 = packssdw(auVar139,auVar139);
      auVar139 = packsswb(auVar139,auVar139);
      if ((auVar139 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(char *)(lVar55 + uVar51 * 4 + -0x2c) = cVar14;
      }
      auVar74 = auVar73 & auVar106 | auVar74;
      auVar139 = packssdw(auVar74,auVar74);
      auVar139 = packssdw(auVar139 ^ auVar130,auVar139 ^ auVar130);
      auVar139 = packsswb(auVar139,auVar139);
      if ((auVar139._4_2_ >> 8 & 1) != 0) {
        *(char *)(lVar55 + uVar51 * 4 + -0x28) = cVar14;
      }
      auVar139 = (auVar58 | auVar84) ^ _DAT_00122280;
      iVar159 = -(uint)(iVar22 < auVar139._0_4_);
      auVar121._4_4_ = -(uint)(iVar25 < auVar139._4_4_);
      iVar163 = -(uint)(iVar40 < auVar139._8_4_);
      auVar121._12_4_ = -(uint)(iVar27 < auVar139._12_4_);
      auVar75._4_4_ = iVar159;
      auVar75._0_4_ = iVar159;
      auVar75._8_4_ = iVar163;
      auVar75._12_4_ = iVar163;
      auVar107._4_4_ = -(uint)(auVar139._4_4_ == iVar25);
      auVar107._12_4_ = -(uint)(auVar139._12_4_ == iVar27);
      auVar107._0_4_ = auVar107._4_4_;
      auVar107._8_4_ = auVar107._12_4_;
      auVar121._0_4_ = auVar121._4_4_;
      auVar121._8_4_ = auVar121._12_4_;
      auVar139 = auVar107 & auVar75 | auVar121;
      auVar139 = packssdw(auVar139,auVar139);
      auVar139 = packssdw(auVar139 ^ auVar130,auVar139 ^ auVar130);
      auVar139 = packsswb(auVar139,auVar139);
      if ((auVar139 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(char *)(lVar55 + uVar51 * 4 + -0x24) = cVar14;
      }
      auVar95 = pshufhw(auVar75,auVar75,0x84);
      auVar105 = pshufhw(auVar107,auVar107,0x84);
      auVar128 = pshufhw(auVar95,auVar121,0x84);
      auVar95 = (auVar128 | auVar105 & auVar95) ^ auVar130;
      auVar95 = packssdw(auVar95,auVar95);
      auVar95 = packsswb(auVar95,auVar95);
      if ((auVar95._6_2_ >> 8 & 1) != 0) {
        *(char *)(lVar55 + uVar51 * 4 + -0x20) = cVar14;
      }
      auVar95 = (auVar58 | auVar132) ^ _DAT_00122280;
      iVar159 = -(uint)(iVar22 < auVar95._0_4_);
      auVar77._4_4_ = -(uint)(iVar25 < auVar95._4_4_);
      iVar163 = -(uint)(iVar40 < auVar95._8_4_);
      auVar77._12_4_ = -(uint)(iVar27 < auVar95._12_4_);
      auVar108._4_4_ = iVar159;
      auVar108._0_4_ = iVar159;
      auVar108._8_4_ = iVar163;
      auVar108._12_4_ = iVar163;
      auVar139 = pshuflw(auVar139,auVar108,0xe8);
      auVar76._4_4_ = -(uint)(auVar95._4_4_ == iVar25);
      auVar76._12_4_ = -(uint)(auVar95._12_4_ == iVar27);
      auVar76._0_4_ = auVar76._4_4_;
      auVar76._8_4_ = auVar76._12_4_;
      auVar128 = pshuflw(auVar130,auVar76,0xe8);
      auVar77._0_4_ = auVar77._4_4_;
      auVar77._8_4_ = auVar77._12_4_;
      auVar95 = pshuflw(auVar139,auVar77,0xe8);
      auVar131._8_4_ = 0xffffffff;
      auVar131._0_8_ = 0xffffffffffffffff;
      auVar131._12_4_ = 0xffffffff;
      auVar139 = (auVar95 | auVar128 & auVar139) ^ auVar131;
      auVar139 = packssdw(auVar139,auVar139);
      auVar139 = packsswb(auVar139,auVar139);
      if ((auVar139 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(char *)(lVar55 + uVar51 * 4 + -0x1c) = cVar14;
      }
      auVar77 = auVar76 & auVar108 | auVar77;
      auVar139 = packssdw(auVar77,auVar77);
      auVar139 = packssdw(auVar139 ^ auVar131,auVar139 ^ auVar131);
      auVar139 = packsswb(auVar139,auVar139);
      if ((auVar139._8_2_ >> 8 & 1) != 0) {
        *(char *)(lVar55 + uVar51 * 4 + -0x18) = cVar14;
      }
      auVar139 = (auVar58 | auVar82) ^ _DAT_00122280;
      iVar159 = -(uint)(iVar22 < auVar139._0_4_);
      auVar122._4_4_ = -(uint)(iVar25 < auVar139._4_4_);
      iVar163 = -(uint)(iVar40 < auVar139._8_4_);
      auVar122._12_4_ = -(uint)(iVar27 < auVar139._12_4_);
      auVar78._4_4_ = iVar159;
      auVar78._0_4_ = iVar159;
      auVar78._8_4_ = iVar163;
      auVar78._12_4_ = iVar163;
      auVar109._4_4_ = -(uint)(auVar139._4_4_ == iVar25);
      auVar109._12_4_ = -(uint)(auVar139._12_4_ == iVar27);
      auVar109._0_4_ = auVar109._4_4_;
      auVar109._8_4_ = auVar109._12_4_;
      auVar122._0_4_ = auVar122._4_4_;
      auVar122._8_4_ = auVar122._12_4_;
      auVar139 = auVar109 & auVar78 | auVar122;
      auVar139 = packssdw(auVar139,auVar139);
      auVar139 = packssdw(auVar139 ^ auVar131,auVar139 ^ auVar131);
      auVar139 = packsswb(auVar139,auVar139);
      if ((auVar139 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        *(char *)(lVar55 + uVar51 * 4 + -0x14) = cVar14;
      }
      auVar95 = pshufhw(auVar78,auVar78,0x84);
      auVar105 = pshufhw(auVar109,auVar109,0x84);
      auVar128 = pshufhw(auVar95,auVar122,0x84);
      auVar95 = (auVar128 | auVar105 & auVar95) ^ auVar131;
      auVar95 = packssdw(auVar95,auVar95);
      auVar95 = packsswb(auVar95,auVar95);
      if ((auVar95._10_2_ >> 8 & 1) != 0) {
        *(char *)(lVar55 + uVar51 * 4 + -0x10) = cVar14;
      }
      auVar95 = (auVar58 | auVar64) ^ _DAT_00122280;
      iVar159 = -(uint)(iVar22 < auVar95._0_4_);
      auVar80._4_4_ = -(uint)(iVar25 < auVar95._4_4_);
      iVar163 = -(uint)(iVar40 < auVar95._8_4_);
      auVar80._12_4_ = -(uint)(iVar27 < auVar95._12_4_);
      auVar110._4_4_ = iVar159;
      auVar110._0_4_ = iVar159;
      auVar110._8_4_ = iVar163;
      auVar110._12_4_ = iVar163;
      auVar139 = pshuflw(auVar139,auVar110,0xe8);
      auVar79._4_4_ = -(uint)(auVar95._4_4_ == iVar25);
      auVar79._12_4_ = -(uint)(auVar95._12_4_ == iVar27);
      auVar79._0_4_ = auVar79._4_4_;
      auVar79._8_4_ = auVar79._12_4_;
      auVar128 = pshuflw(auVar131,auVar79,0xe8);
      auVar80._0_4_ = auVar80._4_4_;
      auVar80._8_4_ = auVar80._12_4_;
      auVar95 = pshuflw(auVar139,auVar80,0xe8);
      in_XMM6._8_4_ = 0xffffffff;
      in_XMM6._0_8_ = 0xffffffffffffffff;
      in_XMM6._12_4_ = 0xffffffff;
      auVar139 = (auVar95 | auVar128 & auVar139) ^ in_XMM6;
      auVar139 = packssdw(auVar139,auVar139);
      in_XMM5 = packsswb(auVar139,auVar139);
      if ((in_XMM5 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(char *)(lVar55 + uVar51 * 4 + -0xc) = cVar14;
      }
      auVar80 = auVar79 & auVar110 | auVar80;
      auVar139 = packssdw(auVar80,auVar80);
      auVar139 = packssdw(auVar139 ^ in_XMM6,auVar139 ^ in_XMM6);
      auVar139 = packsswb(auVar139,auVar139);
      if ((auVar139._12_2_ >> 8 & 1) != 0) {
        *(char *)(lVar55 + uVar51 * 4 + -8) = cVar14;
      }
      auVar139 = (auVar58 | auVar127) ^ _DAT_00122280;
      auVar111._0_4_ = -(uint)(iVar22 < auVar139._0_4_);
      auVar111._4_4_ = -(uint)(iVar25 < auVar139._4_4_);
      auVar111._8_4_ = -(uint)(iVar40 < auVar139._8_4_);
      auVar111._12_4_ = -(uint)(iVar27 < auVar139._12_4_);
      auVar81._4_4_ = auVar111._0_4_;
      auVar81._0_4_ = auVar111._0_4_;
      auVar81._8_4_ = auVar111._8_4_;
      auVar81._12_4_ = auVar111._8_4_;
      auVar59._4_4_ = -(uint)(auVar139._4_4_ == iVar25);
      auVar59._12_4_ = -(uint)(auVar139._12_4_ == iVar27);
      auVar59._0_4_ = auVar59._4_4_;
      auVar59._8_4_ = auVar59._12_4_;
      auVar63._4_4_ = auVar111._4_4_;
      auVar63._0_4_ = auVar111._4_4_;
      auVar63._8_4_ = auVar111._12_4_;
      auVar63._12_4_ = auVar111._12_4_;
      auVar139 = packssdw(auVar111,auVar59 & auVar81 | auVar63);
      auVar139 = packssdw(auVar139 ^ in_XMM6,auVar139 ^ in_XMM6);
      auVar139 = packsswb(auVar139,auVar139);
      if ((auVar139 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(char *)(lVar55 + uVar51 * 4 + -4) = cVar14;
      }
      auVar128 = pshufhw(auVar81,auVar81,0x84);
      auVar139 = pshufhw(auVar59,auVar59,0x84);
      auVar95 = pshufhw(auVar63,auVar63,0x84);
      auVar139 = packssdw(auVar139 & auVar128,(auVar95 | auVar139 & auVar128) ^ in_XMM6);
      auVar139 = packsswb(auVar139,auVar139);
      if ((auVar139._14_2_ >> 8 & 1) != 0) {
        *(char *)(lVar55 + uVar51 * 4) = cVar14;
      }
      uVar51 = uVar51 + 0x10;
    } while ((uVar24 + 0xf & 0xfffffff0) != uVar51);
  }
  uVar57 = uVar57 + 1;
  lVar55 = lVar55 + 1;
  if (uVar57 == 4) {
LAB_0010ec4e:
    if (3 < uVar35) {
      if (*piVar49 == 0x10) {
        if (0 < (int)uVar24) {
          uVar57 = 0;
          do {
            uVar37 = *(ushort *)((long)pvVar33 + uVar57 * 8 + 6);
            if ((uVar37 != 0) && (uVar37 != 0xffff)) {
              fVar119 = 1.0 / ((float)uVar37 / 65535.0);
              fVar102 = (1.0 - fVar119) * 65535.0;
              uVar35 = *(uint *)((long)pvVar33 + uVar57 * 8);
              auVar126._0_4_ = (int)(fVar102 + fVar119 * (float)(uVar35 & 0xffff));
              auVar126._4_4_ = (int)(fVar102 + fVar119 * (float)(uVar35 >> 0x10));
              auVar126._8_4_ = (int)(fVar102 + fVar119 * 0.0);
              auVar126._12_4_ = (int)(fVar102 + fVar119 * 0.0);
              auVar127 = pshuflw(auVar126,auVar126,0xe8);
              *(int *)((long)pvVar33 + uVar57 * 8) = auVar127._0_4_;
              *(short *)((long)pvVar33 + uVar57 * 8 + 4) =
                   (short)(int)((float)*(ushort *)((long)pvVar33 + uVar57 * 8 + 4) * fVar119 +
                               fVar102);
            }
            uVar57 = uVar57 + 1;
          } while (uVar56 != uVar57);
        }
      }
      else if (0 < (int)uVar24) {
        uVar57 = 0;
        do {
          bVar19 = *(byte *)((long)pvVar33 + uVar57 * 4 + 3);
          if ((bVar19 != 0) && (bVar19 != 0xff)) {
            fVar119 = 1.0 / ((float)bVar19 / 255.0);
            fVar102 = (1.0 - fVar119) * 255.0;
            *(char *)((long)pvVar33 + uVar57 * 4) =
                 (char)(int)((float)*(byte *)((long)pvVar33 + uVar57 * 4) * fVar119 + fVar102);
            *(char *)((long)pvVar33 + uVar57 * 4 + 1) =
                 (char)(int)((float)*(byte *)((long)pvVar33 + uVar57 * 4 + 1) * fVar119 + fVar102);
            *(char *)((long)pvVar33 + uVar57 * 4 + 2) =
                 (char)(int)((float)*(byte *)((long)pvVar33 + uVar57 * 4 + 2) * fVar119 + fVar102);
          }
          uVar57 = uVar57 + 1;
        } while (uVar56 != uVar57);
      }
    }
    if (local_96e8 != (int *)0x0) {
      *local_96e8 = 4;
    }
    *local_96d0 = (int)local_96e0;
    *local_96f0 = sVar21;
    return pvVar33;
  }
  goto LAB_0010e74b;
LAB_0010d454:
  sVar9 = stbi__get8(s);
  if (sVar9 == '!') {
    sVar9 = stbi__get8(s);
    if (sVar9 == 0xf9) {
      bVar19 = stbi__get8(s);
      if (bVar19 == 4) {
        bVar19 = stbi__get8(s);
        local_9058 = (stbi_uc *)CONCAT44(local_9058._4_4_,(uint)bVar19);
        bVar10 = stbi__get8(s);
        bVar11 = stbi__get8(s);
        local_820 = ((uint)bVar11 * 0x200 + (uint)bVar10 * 2) * 5;
        if (-1 < (int)(uint)uVar56) {
          *(undefined1 *)((long)&local_9058 + uVar56 * 4 + 7) = 0xff;
        }
        if ((bVar19 & 1) != 0) {
          bVar19 = stbi__get8(s);
          uVar56 = (ulong)bVar19;
          local_9060 = (stbi_uc *)(ulong)CONCAT14(bVar19,(int)local_9060);
          *(undefined1 *)((long)&local_9058 + uVar56 * 4 + 7) = 0;
          goto LAB_0010d575;
        }
        if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
          psVar32 = s->img_buffer;
LAB_0010d555:
          s->img_buffer = psVar32 + 1;
        }
        else {
          psVar32 = s->img_buffer;
          iVar22 = (int)s->img_buffer_end - (int)psVar32;
          if (0 < iVar22) goto LAB_0010d555;
          s->img_buffer = s->img_buffer_end;
          (*(s->io).skip)(s->io_user_data,1 - iVar22);
        }
        local_9060 = (stbi_uc *)CONCAT44(0xffffffff,(int)local_9060);
        uVar56 = 0xffffffff;
        goto LAB_0010d575;
      }
      stbi__skip(s,(uint)bVar19);
    }
    else {
LAB_0010d575:
      bVar19 = stbi__get8(s);
      while (bVar19 != 0) {
        stbi__skip(s,(uint)bVar19);
        bVar19 = stbi__get8(s);
      }
    }
    goto LAB_0010d454;
  }
  if (sVar9 != ';') {
    if (sVar9 == ',') {
      sVar9 = stbi__get8(s);
      sVar12 = stbi__get8(s);
      sVar13 = stbi__get8(s);
      sVar16 = stbi__get8(s);
      sVar17 = stbi__get8(s);
      sVar18 = stbi__get8(s);
      bVar19 = stbi__get8(s);
      bVar10 = stbi__get8(s);
      iVar22 = (uint)CONCAT11(sVar18,sVar17) + (uint)CONCAT11(sVar12,sVar9);
      pcVar31 = "bad Image Descriptor";
      if (iVar22 <= (int)uVar35) {
        iVar25 = (uint)bVar19 + (uint)bVar10 * 0x100 + (uint)CONCAT11(sVar16,sVar13);
        if (iVar25 <= (int)uVar24) {
          iVar40 = uVar35 * 4;
          local_83c = (uint)CONCAT11(sVar12,sVar9) << 2;
          local_838 = (uint)CONCAT11(sVar16,sVar13) * iVar40;
          local_834 = iVar22 * 4;
          local_830 = iVar25 * iVar40;
          local_828 = local_830;
          if (CONCAT11(sVar18,sVar17) != 0) {
            local_828 = local_838;
          }
          local_82c = local_83c;
          local_824 = iVar40;
          bVar19 = stbi__get8(s);
          local_840 = (uint)bVar19;
          local_844 = uVar35 << 5;
          if ((bVar19 & 0x40) == 0) {
            local_844 = iVar40;
          }
          local_848 = (int)(local_840 << 0x19) >> 0x1f & 3;
          if ((char)bVar19 < '\0') {
            local_9798 = local_904c.fast + 0x1fc;
            stbi__gif_parse_colortable
                      (s,(stbi_uc (*) [4])local_9798,2 << (bVar19 & 7),
                       -(uint)(((ulong)local_9058 & 1) == 0) | (uint)uVar56);
          }
          else if (((ulong)stack0xffffffffffff6f98 & 0x80) == 0) {
            pcVar31 = "missing color table";
            goto LAB_0010f929;
          }
          local_850 = local_9798;
          bVar19 = stbi__get8(s);
          if (bVar19 < 0xd) {
            uVar35 = 1 << (bVar19 & 0x1f);
            uVar56 = 0;
            do {
              local_8868[0].fast[uVar56 * 2 + 10] = 0xffff;
              *(char *)(local_8868[0].fast + uVar56 * 2 + 0xb) = (char)uVar56;
              *(char *)((long)local_8868[0].fast + uVar56 * 4 + 0x17) = (char)uVar56;
              uVar56 = uVar56 + 1;
            } while (uVar35 != uVar56);
            uVar47 = (2 << (bVar19 & 0x1f)) - 1;
            local_9700 = CONCAT44(local_9700._4_4_,uVar35 + 1);
            local_96e8 = (int *)CONCAT44(local_96e8._4_4_,uVar35 + 2);
            uVar44 = 0;
            uVar24 = 0;
            iVar22 = 0;
            bVar10 = 0;
            uVar54 = uVar35 + 2;
            uVar43 = 0xffffffff;
            iVar25 = bVar19 + 1;
            uVar48 = uVar47;
LAB_00110d94:
            do {
              for (; uVar46 = uVar48, iVar40 = iVar25, uVar38 = uVar43, uVar39 = uVar54,
                  bVar11 = bVar10, iVar25 = iVar22 - iVar40, iVar22 < iVar40; iVar22 = iVar22 + 8) {
                if (uVar44 == 0) {
                  bVar10 = stbi__get8(s);
                  if (bVar10 != 0) {
                    uVar44 = (uint)bVar10;
                    goto LAB_00110db3;
                  }
                  goto LAB_001110fc;
                }
LAB_00110db3:
                uVar44 = uVar44 - 1;
                bVar10 = stbi__get8(s);
                uVar24 = uVar24 | (uint)bVar10 << ((byte)iVar22 & 0x1f);
                bVar10 = bVar11;
                uVar54 = uVar39;
                uVar43 = uVar38;
                iVar25 = iVar40;
                uVar48 = uVar46;
              }
              uVar54 = (int)uVar24 >> ((byte)iVar40 & 0x1f);
              uVar52 = uVar24 & uVar46;
              uVar24 = uVar54;
              iVar22 = iVar25;
              bVar10 = 1;
              uVar54 = (uint)local_96e8;
              uVar43 = 0xffffffff;
              iVar25 = bVar19 + 1;
              uVar48 = uVar47;
            } while (uVar52 == uVar35);
            if (uVar52 == (uint)local_9700) {
              stbi__skip(s,uVar44);
              bVar19 = stbi__get8(s);
              while (bVar19 != 0) {
                stbi__skip(s,(uint)bVar19);
                bVar19 = stbi__get8(s);
              }
LAB_001110fc:
              if ((stbi__context *)local_9088._8_8_ == (stbi__context *)0x0) goto LAB_0010f944;
              if (0 < (int)(local_9088._4_4_ * local_9088._0_4_) && 0 < iStack_9064) {
                uVar56 = 0;
                do {
                  if (*(stbi_uc *)(local_9088._24_8_ + uVar56) == '\0') {
                    *(undefined1 *)((long)&local_9058 + (long)iStack_9064 * 4 + 7) = 0xff;
                    *(undefined4 *)((stbi_uc *)(local_9088._8_8_ + 0x38) + uVar56 * 4 + -0x38) =
                         *(undefined4 *)((long)&local_9058 + (long)iStack_9064 * 4 + 4);
                  }
                  uVar56 = uVar56 + 1;
                } while ((uint)(local_9088._4_4_ * local_9088._0_4_) != uVar56);
              }
              if ((stbi__context *)local_9088._8_8_ == s) goto LAB_0010f932;
              *local_96f0 = local_9088._0_4_;
              *local_96d0 = local_9088._4_4_;
              psVar30 = (stbi__context *)local_9088._8_8_;
              goto LAB_0010f947;
            }
            pcVar31 = "no clear code";
            if ((int)uVar39 < (int)uVar52) {
              pcVar31 = "illegal code in raster";
              goto LAB_0010f929;
            }
            if ((bool)(bVar11 ^ 1)) goto LAB_0010f929;
            if ((int)uVar38 < 0) {
              if (uVar52 == uVar39) goto LAB_001111b5;
            }
            else {
              if (0x1fff < (int)uVar39) {
                pcVar31 = "too many codes";
                goto LAB_0010f929;
              }
              lVar55 = (long)(int)uVar39;
              uVar39 = uVar39 + 1;
              local_8868[0].fast[lVar55 * 2 + 10] = (stbi__uint16)uVar38;
              uVar34 = (undefined1)local_8868[0].fast[(ulong)uVar38 * 2 + 0xb];
              *(undefined1 *)(local_8868[0].fast + lVar55 * 2 + 0xb) = uVar34;
              if (uVar52 != uVar39) {
                uVar34 = (undefined1)local_8868[0].fast[(long)(int)uVar52 * 2 + 0xb];
              }
              *(undefined1 *)((long)local_8868[0].fast + lVar55 * 4 + 0x17) = uVar34;
            }
            stbi__out_gif_code((stbi__gif *)local_9088,(stbi__uint16)uVar52);
            bVar10 = 1;
            uVar54 = uVar39;
            uVar43 = uVar52;
            iVar25 = iVar40 + 1;
            uVar48 = ~(-1 << ((byte)(iVar40 + 1) & 0x1f));
            if (0xfff < (int)uVar39 || (uVar39 & uVar46) != 0) {
              iVar25 = iVar40;
              uVar48 = uVar46;
            }
            goto LAB_00110d94;
          }
          goto LAB_0010f932;
        }
      }
    }
    else {
      pcVar31 = "unknown code";
    }
    goto LAB_0010f929;
  }
LAB_0010f932:
  if ((stbi__context *)local_9088._8_8_ != (stbi__context *)0x0) {
    free((void *)local_9088._8_8_);
  }
LAB_0010f944:
  psVar30 = (stbi__context *)0x0;
LAB_0010f947:
  free((void *)local_9088._24_8_);
  psVar32 = (stbi_uc *)local_9088._16_8_;
LAB_0010d697:
  free(psVar32);
  return psVar30;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   // test the formats with a very explicit header first (at least a FOURCC
   // or distinctive magic number first)
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif

   // then the formats that can end up attempting to load with just 1 or 2
   // bytes matching expectations; these are prone to false positives, so
   // try them later
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}